

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::VolPathIntegrator::SampleLd
          (VolPathIntegrator *this,Interaction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler,SampledSpectrum *beta,SampledSpectrum *pathPDF)

{
  Vector3f *pVVar1;
  float **ppfVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  ulong uVar7;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  byte bVar12;
  Vector3f wiRender;
  Vector3f wiRender_00;
  Vector3f woRender;
  Point3fi *pPVar13;
  Point3fi *pPVar14;
  MediumHandle MVar15;
  Interval<float> *pIVar16;
  Interval<float> IVar17;
  bool bVar18;
  SurfaceInteraction *pSVar19;
  SampledLight *pSVar20;
  MediumInteraction *pMVar21;
  uint64_t sequenceIndex;
  uint64_t seed;
  ShapeIntersection *pSVar22;
  float *pfVar23;
  undefined8 *puVar24;
  float *pfVar25;
  float *pfVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  pbrt *this_00;
  int iVar30;
  int iVar31;
  long lVar32;
  int *piVar33;
  int *piVar34;
  DenselySampledSpectrum *this_01;
  ulong uVar35;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  Float FVar40;
  type a;
  float fVar43;
  Point2f PVar44;
  float fVar41;
  Float FVar42;
  undefined1 auVar45 [16];
  undefined8 uVar124;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar125 [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar49 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar123 [64];
  float fVar126;
  undefined1 auVar193 [12];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar195 [64];
  float fVar196;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar208 [64];
  float fVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar216;
  undefined1 in_ZMM12 [64];
  undefined1 auVar217 [64];
  float fVar218;
  float fVar219;
  undefined1 in_XMM16 [16];
  anon_class_16_2_f9f09593 func;
  anon_class_16_2_f9f09593 func_00;
  Vector3<float> VVar220;
  Point3f PVar221;
  Point3<float> PVar222;
  SampledSpectrum SVar223;
  undefined1 local_5e8 [16];
  Float tMax;
  Float tMin;
  float local_5c4;
  SampledWavelengths *local_5c0;
  Float local_5b4;
  int voxel [3];
  float nextCrossingT [3];
  undefined1 local_598 [12];
  float fStack_58c;
  undefined1 local_588 [8];
  RNG *local_580;
  MediumHandle local_578;
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  Tuple3<pbrt::Point3,_float> local_548;
  SampledSpectrum sigma_maj;
  Ray lightRay;
  int voxelLimit [3];
  int step [3];
  float deltaT [3];
  Ray ray;
  SampledSpectrum sigma_s;
  RNG rng;
  Vector3f wi;
  PhaseFunctionHandle local_480;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_478;
  Tuple3<pbrt::Vector3,_float> local_470;
  Tuple3<pbrt::Point3,_float> local_460;
  SampledSpectrum sigma_a;
  SampledSpectrum sigma_a_1;
  SampledSpectrum density;
  Vector3f wo;
  aligned_storage_t<sizeof(pbrt::MediumInteraction),_alignof(pbrt::MediumInteraction)> local_3f8;
  undefined1 local_360;
  undefined1 local_358 [16];
  Interval<float> *local_348;
  SampledSpectrum local_340;
  SampledSpectrum Le;
  SampledSpectrum sigma_t;
  SampledSpectrum pdfLight;
  SampledSpectrum throughput;
  Interval<float> local_2e8;
  Interval<float> IStack_2e0;
  Interval<float> local_2d8;
  undefined8 local_2d0;
  float fStack_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  float local_2bc;
  SampledSpectrum pdfUni;
  SampledSpectrum betaLight;
  SampledSpectrum local_288;
  optional<pbrt::SampledLight> sampledLight;
  MediumInteraction intr_1;
  optional<pbrt::ShapeIntersection> si;
  LightLiSample ls;
  undefined1 auVar50 [64];
  undefined1 auVar91 [64];
  undefined1 extraout_var [60];
  undefined1 auVar194 [56];
  float fVar207;
  
  auVar37 = in_ZMM12._0_16_;
  auVar39 = in_ZMM5._0_16_;
  local_5c0 = lambda;
  FVar40 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
  if (bsdf == (BSDF *)0x0) {
    si.optionalValue._16_8_ =
         (intr->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    si.optionalValue._0_4_ =
         (intr->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    si.optionalValue._4_4_ =
         (intr->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    si.optionalValue._8_4_ =
         (intr->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    si.optionalValue._12_4_ =
         (intr->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    si.optionalValue._40_4_ = 0;
    si.optionalValue._44_4_ = 0;
    si.optionalValue._24_8_ = 0;
    si.optionalValue._32_4_ = 0;
    si.optionalValue._36_4_ = 0;
  }
  else {
    pSVar19 = Interaction::AsSurface(intr);
    si.optionalValue._16_8_ =
         (pSVar19->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    pPVar13 = &(pSVar19->super_Interaction).pi;
    pPVar14 = &(pSVar19->super_Interaction).pi;
    si.optionalValue._0_4_ =
         (pPVar13->super_Point3<pbrt::Interval<float>_>).
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    si.optionalValue._4_4_ =
         (pPVar13->super_Point3<pbrt::Interval<float>_>).
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    si.optionalValue._8_4_ =
         (pPVar14->super_Point3<pbrt::Interval<float>_>).
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    si.optionalValue._12_4_ =
         (pPVar14->super_Point3<pbrt::Interval<float>_>).
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    si.optionalValue._24_4_ = (pSVar19->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    si.optionalValue._28_4_ = (pSVar19->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    si.optionalValue._32_4_ = (pSVar19->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    uVar5 = (pSVar19->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar8 = (pSVar19->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    si.optionalValue._44_4_ = (pSVar19->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    si.optionalValue._36_4_ = uVar5;
    si.optionalValue._40_4_ = uVar8;
  }
  LightSamplerHandle::Sample(&sampledLight,&this->lightSampler,(LightSampleContext *)&si,FVar40);
  PVar44 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
  local_5e8._8_8_ = extraout_XMM0_Qb;
  local_5e8._0_4_ = PVar44.super_Tuple2<pbrt::Point2,_float>.x;
  local_5e8._4_4_ = PVar44.super_Tuple2<pbrt::Point2,_float>.y;
  if (sampledLight.set != false) {
    pSVar20 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
    uVar7 = (pSVar20->light).
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits;
    if (uVar7 != 0) {
      pSVar20 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
      if ((pSVar20->pdf != 0.0) || (NAN(pSVar20->pdf))) {
        if (bsdf == (BSDF *)0x0) {
          local_2d8 = (intr->pi).super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          local_2e8 = (intr->pi).super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          IStack_2e0 = (intr->pi).super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          uStack_2c0 = 0;
          local_2bc = 0.0;
          local_2d0 = 0;
          fStack_2c8 = 0.0;
          uStack_2c4 = 0;
        }
        else {
          pSVar19 = Interaction::AsSurface(intr);
          local_2d8 = (pSVar19->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          local_2e8 = (pSVar19->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          IStack_2e0 = (pSVar19->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          fStack_2c8 = (pSVar19->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
          local_2d0._0_4_ = (pSVar19->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
          local_2d0._4_4_ = (pSVar19->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
          uVar6 = (pSVar19->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
          uVar9 = (pSVar19->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
          local_2bc = (pSVar19->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
          uStack_2c4 = uVar6;
          uStack_2c0 = uVar9;
        }
        local_3f8.__align = (anon_struct_8_0_00000001_for___align)&si;
        si.optionalValue._24_8_ = local_2d0;
        si.optionalValue._16_4_ = local_2d8.low;
        si.optionalValue._20_4_ = local_2d8.high;
        si.optionalValue._32_4_ = fStack_2c8;
        si.optionalValue._36_4_ = uStack_2c4;
        si.optionalValue._40_4_ = uStack_2c0;
        si.optionalValue._44_4_ = local_2bc;
        local_3f8._16_8_ = &intr_1;
        local_3f8._24_8_ = &lightRay;
        si.optionalValue._8_4_ = IStack_2e0.low;
        si.optionalValue._12_4_ = IStack_2e0.high;
        si.optionalValue.__align = (anon_struct_8_0_00000001_for___align)local_2e8;
        intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
             *(undefined1 (*) [16])(local_5c0->lambda).values;
        intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = (local_5c0->pdf).values[0];
        intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = (local_5c0->pdf).values[1];
        intr_1.super_Interaction.time = (local_5c0->pdf).values[2];
        intr_1.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x =
             (local_5c0->pdf).values[3];
        local_3f8._8_8_ = local_598;
        lightRay.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
        local_598._0_8_ = vmovlps_avx(local_5e8);
        ray.o.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar7;
        ray.o.super_Tuple3<pbrt::Point3,_float>.y = (float)(uVar7 >> 0x20);
        auVar208 = ZEXT1664(auVar39);
        auVar217 = ZEXT1664(auVar37);
        detail::DispatchSplit<9>::operator()
                  (&ls,(DispatchSplit<9> *)&sigma_a_1,&ray,uVar7 >> 0x30,
                   CONCAT44(uStack_2c0,uStack_2c4),local_2bc,local_3f8.__align,local_3f8._8_8_,
                   local_3f8._16_8_,local_3f8._24_8_);
        if (0.0 < ls.pdf) {
          bVar18 = SampledSpectrum::operator_cast_to_bool(&ls.L);
          if (bVar18) {
            pSVar20 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
            betaLight.values.values._0_8_ = *(undefined8 *)(beta->values).values;
            betaLight.values.values._8_8_ = *(undefined8 *)((beta->values).values + 2);
            fVar3 = pSVar20->pdf;
            wo.super_Tuple3<pbrt::Vector3,_float>.z =
                 (intr->wo).super_Tuple3<pbrt::Vector3,_float>.z;
            pVVar1 = &intr->wo;
            wo.super_Tuple3<pbrt::Vector3,_float>.x = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x
            ;
            wo.super_Tuple3<pbrt::Vector3,_float>.y = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y
            ;
            wi.super_Tuple3<pbrt::Vector3,_float>.z = ls.wi.super_Tuple3<pbrt::Vector3,_float>.z;
            wi.super_Tuple3<pbrt::Vector3,_float>.x = ls.wi.super_Tuple3<pbrt::Vector3,_float>.x;
            wi.super_Tuple3<pbrt::Vector3,_float>.y = ls.wi.super_Tuple3<pbrt::Vector3,_float>.y;
            if (bsdf == (BSDF *)0x0) {
              bVar18 = Interaction::IsMediumInteraction(intr);
              if (!bVar18) {
                LogFatal<char_const(&)[27]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                           ,0x522,"Check failed: %s",(char (*) [27])"intr.IsMediumInteraction()");
              }
              pMVar21 = Interaction::AsMedium(intr);
              si.optionalValue.__align =
                   (anon_struct_8_0_00000001_for___align)
                   (pMVar21->phase).super_TaggedPointer<pbrt::HGPhaseFunction>.bits;
              func.wi = &wi;
              func.wo = &wo;
              FVar40 = TaggedPointer<pbrt::HGPhaseFunction>::
                       Dispatch<pbrt::PhaseFunctionHandle::p(pbrt::Vector3<float>const&,pbrt::Vector3<float>const&)const::_lambda(auto:1)_1_>
                                 ((TaggedPointer<pbrt::HGPhaseFunction> *)&si,func);
              SampledSpectrum::operator*=(&betaLight,FVar40);
              func_00.wi = &wi;
              func_00.wo = &wo;
              FVar40 = TaggedPointer<pbrt::HGPhaseFunction>::
                       Dispatch<pbrt::PhaseFunctionHandle::PDF(pbrt::Vector3<float>const&,pbrt::Vector3<float>const&)const::_lambda(auto:1)_1_>
                                 ((TaggedPointer<pbrt::HGPhaseFunction> *)&si,func_00);
            }
            else {
              wiRender.super_Tuple3<pbrt::Vector3,_float>.z =
                   ls.wi.super_Tuple3<pbrt::Vector3,_float>.z;
              wiRender.super_Tuple3<pbrt::Vector3,_float>.x =
                   ls.wi.super_Tuple3<pbrt::Vector3,_float>.x;
              wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
                   ls.wi.super_Tuple3<pbrt::Vector3,_float>.y;
              auVar194 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
              auVar125 = ZEXT856(0);
              SVar223 = BSDF::f(bsdf,(Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,wiRender,
                                Radiance);
              auVar130._0_8_ = SVar223.values.values._8_8_;
              auVar130._8_56_ = auVar194;
              auVar195._0_8_ = SVar223.values.values._0_8_;
              auVar195._8_56_ = auVar125;
              auVar39 = vmovlhps_avx(auVar195._0_16_,auVar130._0_16_);
              local_3f8.__align = auVar39._0_8_;
              local_3f8._8_4_ = auVar39._8_4_;
              local_3f8._12_4_ = auVar39._12_4_;
              pSVar19 = Interaction::AsSurface(intr);
              a = AbsDot<float>(&wi,&(pSVar19->shading).n);
              auVar125 = extraout_var_00;
              SVar223 = SampledSpectrum::operator*((SampledSpectrum *)&local_3f8.__align,a);
              auVar131._0_8_ = SVar223.values.values._8_8_;
              auVar131._8_56_ = auVar194;
              auVar49._0_8_ = SVar223.values.values._0_8_;
              auVar49._8_56_ = auVar125;
              si.optionalValue._0_16_ = vmovlhps_avx(auVar49._0_16_,auVar131._0_16_);
              SampledSpectrum::operator*=(&betaLight,(SampledSpectrum *)&si);
              woRender.super_Tuple3<pbrt::Vector3,_float>.z =
                   wo.super_Tuple3<pbrt::Vector3,_float>.z;
              woRender.super_Tuple3<pbrt::Vector3,_float>.x =
                   wo.super_Tuple3<pbrt::Vector3,_float>.x;
              woRender.super_Tuple3<pbrt::Vector3,_float>.y =
                   wo.super_Tuple3<pbrt::Vector3,_float>.y;
              wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z =
                   wi.super_Tuple3<pbrt::Vector3,_float>.z;
              wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x =
                   wi.super_Tuple3<pbrt::Vector3,_float>.x;
              wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y =
                   wi.super_Tuple3<pbrt::Vector3,_float>.y;
              FVar40 = BSDF::PDF(bsdf,woRender,wiRender_00,Radiance,All);
            }
            bVar18 = SampledSpectrum::operator_cast_to_bool(&betaLight);
            if (bVar18) {
              Interaction::SpawnRayTo(&lightRay,intr,&ls.pLight);
              SampledSpectrum::SampledSpectrum(&throughput,1.0);
              SampledSpectrum::SampledSpectrum(&pdfLight,1.0);
              this_00 = (pbrt *)&pdfUni;
              SampledSpectrum::SampledSpectrum((SampledSpectrum *)this_00,1.0);
              PVar222.super_Tuple3<pbrt::Point3,_float>.y =
                   lightRay.o.super_Tuple3<pbrt::Point3,_float>.y;
              PVar222.super_Tuple3<pbrt::Point3,_float>.x =
                   lightRay.o.super_Tuple3<pbrt::Point3,_float>.x;
              PVar222.super_Tuple3<pbrt::Point3,_float>.z =
                   lightRay.o.super_Tuple3<pbrt::Point3,_float>.z;
              sequenceIndex = Hash<pbrt::Point3<float>>(this_00,PVar222);
              VVar220.super_Tuple3<pbrt::Vector3,_float>.y =
                   lightRay.d.super_Tuple3<pbrt::Vector3,_float>.y;
              VVar220.super_Tuple3<pbrt::Vector3,_float>.x =
                   lightRay.d.super_Tuple3<pbrt::Vector3,_float>.x;
              VVar220.super_Tuple3<pbrt::Vector3,_float>.z =
                   lightRay.d.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar195 = ZEXT6064((undefined1  [60])0x0) << 0x20;
              seed = Hash<pbrt::Vector3<float>>(this_00,VVar220);
              RNG::SetSequence(&rng,sequenceIndex,seed);
              local_348 = (Interval<float> *)local_358;
LAB_00435524:
              auVar125 = auVar195._8_56_;
              Integrator::Intersect(&si,(Integrator *)this,&lightRay,0.9999);
              if (si.set != true) {
LAB_00435572:
                if (lightRay.medium.
                    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                    .bits != 0) {
                  FVar42 = 0.9999;
                  if (si.set == true) {
                    pSVar22 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
                    FVar42 = pSVar22->tHit;
                  }
                  MVar15.
                  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                  .bits = lightRay.medium.
                          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                          .bits;
                  fVar41 = lightRay.d.super_Tuple3<pbrt::Vector3,_float>.y;
                  this_01 = (DenselySampledSpectrum *)
                            ((ulong)lightRay.medium.
                                    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                                    .bits & 0xffffffffffff);
                  if ((ulong)lightRay.medium.
                             super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                             .bits < 0x3000000000000) {
                    local_5e8._0_4_ = FVar42;
                    if (((ulong)lightRay.medium.
                                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                                .bits & 0x3000000000000) == 0x2000000000000) {
                      sigma_a_1.values.values._8_8_ = &pdfLight;
                      sigma_a_1.values.values._0_8_ = &throughput;
                      auVar39 = vfmadd231ss_fma(ZEXT416((uint)(lightRay.d.
                                                               super_Tuple3<pbrt::Vector3,_float>.y
                                                              * lightRay.d.
                                                                super_Tuple3<pbrt::Vector3,_float>.y
                                                              )),
                                                ZEXT416((uint)lightRay.d.
                                                              super_Tuple3<pbrt::Vector3,_float>.x),
                                                ZEXT416((uint)lightRay.d.
                                                              super_Tuple3<pbrt::Vector3,_float>.x))
                      ;
                      auVar125 = ZEXT856(auVar39._8_8_);
                      auVar39 = vfmadd213ss_fma(ZEXT416((uint)lightRay.d.
                                                              super_Tuple3<pbrt::Vector3,_float>.z),
                                                ZEXT416((uint)lightRay.d.
                                                              super_Tuple3<pbrt::Vector3,_float>.z),
                                                auVar39);
                      auVar39 = vsqrtss_avx(auVar39,auVar39);
                      local_5c4 = auVar39._0_4_ * FVar42;
                      auVar194 = (undefined1  [56])0x0;
                      VVar220 = Normalize<float>(&lightRay.d);
                      local_3f8._20_4_ = VVar220.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar50._0_8_ = VVar220.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                      auVar50._8_56_ = auVar194;
                      local_3f8._4_4_ = lightRay.o.super_Tuple3<pbrt::Point3,_float>.y;
                      local_3f8._0_4_ = lightRay.o.super_Tuple3<pbrt::Point3,_float>.x;
                      local_3f8._8_4_ = lightRay.o.super_Tuple3<pbrt::Point3,_float>.z;
                      uVar124 = vmovlps_avx(auVar50._0_16_);
                      local_3f8._12_4_ = (undefined4)uVar124;
                      local_3f8._16_4_ = (undefined4)((ulong)uVar124 >> 0x20);
                      local_3f8._24_4_ = 0.0;
                      local_3f8._32_8_ = 0;
                      Transform::operator()
                                (&ray,(Transform *)(this_01 + 3),(Ray *)&local_3f8.__align,
                                 &local_5c4);
                      bVar18 = Bounds3<float>::IntersectP
                                         ((Bounds3<float> *)&this_01->values,&ray.o,&ray.d,local_5c4
                                          ,&tMin,&tMax);
                      auVar39 = auVar208._0_16_;
                      if (bVar18) {
                        FVar42 = *(Float *)&this_01[2].values.nStored;
                        auVar194 = (undefined1  [56])0x0;
                        SVar223 = DenselySampledSpectrum::Sample
                                            ((DenselySampledSpectrum *)&(this_01->values).nStored,
                                             local_5c0);
                        auVar132._0_8_ = SVar223.values.values._8_8_;
                        auVar132._8_56_ = auVar125;
                        auVar51._0_8_ = SVar223.values.values._0_8_;
                        auVar51._8_56_ = auVar194;
                        auVar37 = vmovlhps_avx(auVar51._0_16_,auVar132._0_16_);
                        local_3f8.__align = auVar37._0_8_;
                        local_3f8._8_4_ = auVar37._8_4_;
                        local_3f8._12_4_ = auVar37._12_4_;
                        auVar194 = (undefined1  [56])0x0;
                        SVar223 = SampledSpectrum::operator*
                                            ((SampledSpectrum *)&local_3f8.__align,FVar42);
                        auVar133._0_8_ = SVar223.values.values._8_8_;
                        auVar133._8_56_ = auVar125;
                        auVar52._0_8_ = SVar223.values.values._0_8_;
                        auVar52._8_56_ = auVar194;
                        sigma_a.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar52._0_16_,auVar133._0_16_);
                        FVar42 = *(Float *)&this_01[2].values.nStored;
                        auVar194 = (undefined1  [56])0x0;
                        SVar223 = DenselySampledSpectrum::Sample
                                            ((DenselySampledSpectrum *)&this_01[1].values.nStored,
                                             local_5c0);
                        auVar134._0_8_ = SVar223.values.values._8_8_;
                        auVar134._8_56_ = auVar125;
                        auVar53._0_8_ = SVar223.values.values._0_8_;
                        auVar53._8_56_ = auVar194;
                        auVar37 = vmovlhps_avx(auVar53._0_16_,auVar134._0_16_);
                        local_3f8.__align = auVar37._0_8_;
                        local_3f8._8_4_ = auVar37._8_4_;
                        local_3f8._12_4_ = auVar37._12_4_;
                        auVar194 = (undefined1  [56])0x0;
                        SVar223 = SampledSpectrum::operator*
                                            ((SampledSpectrum *)&local_3f8.__align,FVar42);
                        auVar135._0_8_ = SVar223.values.values._8_8_;
                        auVar135._8_56_ = auVar125;
                        auVar54._0_8_ = SVar223.values.values._0_8_;
                        auVar54._8_56_ = auVar194;
                        sigma_s.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar54._0_16_,auVar135._0_16_);
                        auVar194 = ZEXT856(sigma_s.values.values._8_8_);
                        SVar223 = SampledSpectrum::operator+(&sigma_a,&sigma_s);
                        auVar136._0_8_ = SVar223.values.values._8_8_;
                        auVar136._8_56_ = auVar125;
                        auVar55._0_8_ = SVar223.values.values._0_8_;
                        auVar55._8_56_ = auVar194;
                        sigma_t.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar55._0_16_,auVar136._0_16_);
                        auVar125 = ZEXT856(sigma_t.values.values._8_8_);
                        VVar220 = Bounds3<float>::Diagonal((Bounds3<float> *)&this_01->values);
                        auVar137._4_60_ = auVar136._4_60_;
                        auVar137._0_4_ = VVar220.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar56._0_8_ = VVar220.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                        auVar56._8_56_ = auVar125;
                        auVar197._4_4_ = ray.o.super_Tuple3<pbrt::Point3,_float>.z;
                        auVar197._0_4_ = ray.o.super_Tuple3<pbrt::Point3,_float>.y;
                        auVar197._8_8_ = 0;
                        auVar201._8_8_ = 0;
                        auVar201._0_8_ =
                             *(ulong *)((long)&(this_01->values).alloc.memoryResource + 4);
                        auVar37 = vsubps_avx(auVar197,auVar201);
                        auVar37 = vpermt2ps_avx512vl(auVar37,_DAT_00596440,
                                                     ZEXT416((uint)(ray.o.
                                                  super_Tuple3<pbrt::Point3,_float>.x -
                                                  *(float *)&(this_01->values).alloc.memoryResource)
                                                  ));
                        auVar37 = vinsertps_avx(auVar37,ZEXT416((uint)ray.d.
                                                  super_Tuple3<pbrt::Vector3,_float>.x),0x30);
                        auVar38 = vpermt2ps_avx512vl(auVar56._0_16_,_DAT_00596450,auVar137._0_16_);
                        auVar202._4_4_ = ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar202._0_4_ = ray.d.super_Tuple3<pbrt::Vector3,_float>.y;
                        auVar202._8_8_ = 0;
                        _local_598 = vdivps_avx(auVar37,auVar38);
                        auVar37 = vpermt2ps_avx512vl(auVar56._0_16_,ZEXT816(0x400000001),
                                                     auVar137._0_16_);
                        auVar37 = vdivps_avx(auVar202,auVar37);
                        local_588 = (undefined1  [8])vmovlps_avx(auVar37);
                        auVar125 = (undefined1  [56])0x0;
                        local_580 = (RNG *)((ulong)local_580 & 0xffffffff00000000);
                        local_578.
                        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                                 )0;
                        PVar221 = Ray::operator()((Ray *)local_598,tMin);
                        fVar126 = PVar221.super_Tuple3<pbrt::Point3,_float>.z;
                        auVar57._0_8_ = PVar221.super_Tuple3<pbrt::Point3,_float>._0_8_;
                        auVar57._8_56_ = auVar125;
                        auVar37 = vpcmpeqd_avx(auVar39,auVar39);
                        ppfVar2 = &this_01[10].values.ptr;
                        auVar206 = ZEXT816(0) << 0x40;
                        lVar32 = 0;
                        local_558._0_8_ = ppfVar2;
                        iVar30 = *(int *)&this_01[10].values.ptr;
                        auVar198._8_8_ = 0;
                        auVar198._0_8_ = this_01[10].values.alloc.memoryResource;
                        auVar39 = vcvtdq2ps_avx(auVar198);
                        auVar37 = vpaddd_avx(auVar198,auVar37);
                        auVar37 = vcvtdq2ps_avx(auVar37);
                        fVar41 = auVar39._0_4_;
                        fVar43 = PVar221.super_Tuple3<pbrt::Point3,_float>.x;
                        auVar210._0_4_ = fVar43 * fVar41;
                        auVar210._4_4_ = PVar221.super_Tuple3<pbrt::Point3,_float>.y * auVar39._4_4_
                        ;
                        auVar210._8_4_ = auVar125._0_4_ * auVar39._8_4_;
                        auVar210._12_4_ = auVar125._4_4_ * auVar39._12_4_;
                        auVar39 = vmovshdup_avx(auVar39);
                        fVar207 = 1.0 / fVar41;
                        auVar208 = ZEXT464((uint)fVar207);
                        auVar38 = vmovshdup_avx(auVar37);
                        uVar35 = vcmpps_avx512vl(auVar37,auVar210,1);
                        auVar205 = vmovshdup_avx(auVar210);
                        uVar124 = vcmpss_avx512f(auVar205,auVar206,1);
                        bVar12 = (byte)(uVar35 >> 1);
                        fVar196 = (float)iVar30;
                        uVar10 = vcmpss_avx512f(auVar210,auVar206,1);
                        iVar28 = (int)(float)((uint)!(bool)((byte)uVar124 & 1) *
                                             ((uint)(bVar12 & 1) * auVar38._0_4_ +
                                             (uint)!(bool)(bVar12 & 1) * auVar205._0_4_));
                        iVar29 = (int)(float)((uint)!(bool)((byte)uVar10 & 1) *
                                             ((uint)((byte)uVar35 & 1) * auVar37._0_4_ +
                                             (uint)!(bool)((byte)uVar35 & 1) * (int)auVar210._0_4_))
                        ;
                        auVar211._0_4_ = (float)(iVar30 + -1);
                        auVar211._4_12_ = auVar217._4_12_;
                        fVar209 = auVar39._0_4_;
                        auVar39 = vminss_avx(auVar211,ZEXT416((uint)(fVar126 * fVar196)));
                        uVar124 = vcmpss_avx512f(ZEXT416((uint)(fVar126 * fVar196)),auVar206,1);
                        auVar37 = vmovshdup_avx(auVar57._0_16_);
                        iVar30 = (int)(float)((uint)!(bool)((byte)uVar124 & 1) * auVar39._0_4_);
                        local_5e8._0_4_ = tMin;
                        for (; lVar32 != 3; lVar32 = lVar32 + 1) {
                          pfVar23 = (float *)(local_598 + 0xc);
                          iVar31 = (int)lVar32;
                          if ((iVar31 != 0) && (pfVar23 = (float *)local_588, iVar31 != 1)) {
                            pfVar23 = (float *)((long)local_588 + 4);
                          }
                          if ((*pfVar23 == 0.0) && (!NAN(*pfVar23))) {
                            puVar24 = (undefined8 *)(local_598 + 0xc);
                            if ((iVar31 != 0) && (puVar24 = (undefined8 *)local_588, iVar31 != 1)) {
                              puVar24 = (undefined8 *)((long)local_588 + 4);
                            }
                            *(undefined4 *)puVar24 = 0;
                          }
                          if (iVar31 == 1) {
                            voxel[1] = iVar28;
                            piVar33 = voxelLimit + 1;
                            piVar34 = step + 1;
                            pfVar26 = deltaT + 1;
                            pfVar23 = nextCrossingT + 1;
                            pfVar25 = (float *)local_588;
                            iVar27 = iVar28;
                          }
                          else if (iVar31 == 0) {
                            voxel[lVar32] = iVar29;
                            piVar33 = voxelLimit;
                            piVar34 = step;
                            pfVar26 = deltaT;
                            pfVar23 = nextCrossingT;
                            pfVar25 = (float *)(local_598 + 0xc);
                            iVar27 = iVar29;
                          }
                          else {
                            piVar33 = voxelLimit + 2;
                            piVar34 = step + 2;
                            pfVar26 = deltaT + 2;
                            pfVar23 = nextCrossingT + 2;
                            pfVar25 = (float *)((long)local_588 + 4);
                            voxel[lVar32] = iVar30;
                            iVar27 = iVar30;
                          }
                          if (0.0 <= *pfVar25) {
                            pfVar25 = (float *)(local_598 + 0xc);
                            pvVar36 = &this_01[10].values;
                            fVar216 = fVar41;
                            fVar218 = fVar43;
                            fVar219 = fVar207;
                            if (iVar31 != 0) {
                              pfVar25 = (float *)local_588;
                              pvVar36 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                        ((long)&this_01[10].values.alloc.memoryResource + 4);
                              fVar216 = fVar209;
                              fVar218 = auVar37._0_4_;
                              fVar219 = 1.0 / fVar209;
                              if (iVar31 != 1) {
                                pfVar25 = (float *)((long)local_588 + 4);
                                pvVar36 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *
                                          )ppfVar2;
                                fVar216 = fVar196;
                                fVar218 = fVar126;
                                fVar219 = 1.0 / fVar196;
                              }
                            }
                            *piVar34 = 1;
                            auVar39 = vcvtsi2ss_avx512f(in_XMM16,iVar27 + 1);
                            fVar4 = *pfVar25;
                            *pfVar26 = fVar219 / fVar4;
                            *pfVar23 = (auVar39._0_4_ / fVar216 - fVar218) / fVar4 + tMin;
                            iVar31 = *(int *)&(pvVar36->alloc).memoryResource;
                          }
                          else {
                            pfVar25 = (float *)(local_598 + 0xc);
                            fVar216 = fVar41;
                            fVar218 = fVar43;
                            fVar219 = -fVar207;
                            if (iVar31 != 0) {
                              pfVar25 = (float *)local_588;
                              fVar216 = fVar209;
                              fVar218 = auVar37._0_4_;
                              fVar219 = -(1.0 / fVar209);
                              if (iVar31 != 1) {
                                pfVar25 = (float *)((long)local_588 + 4);
                                fVar216 = fVar196;
                                fVar218 = fVar126;
                                fVar219 = -(1.0 / fVar196);
                              }
                            }
                            auVar39 = vcvtsi2ss_avx512f(in_XMM16,iVar27);
                            *piVar34 = -1;
                            fVar4 = *pfVar25;
                            *pfVar26 = fVar219 / fVar4;
                            *pfVar23 = (auVar39._0_4_ / fVar216 - fVar218) / fVar4 + tMin;
                            iVar31 = -1;
                          }
                          auVar217 = ZEXT464(0);
                          *piVar33 = iVar31;
                        }
                        fVar41 = RNG::Uniform<float>(&rng);
                        local_568._0_4_ = fVar41;
                        while( true ) {
                          auVar194 = (undefined1  [56])0x0;
                          iVar30 = *(int *)(&DAT_00596420 +
                                           (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                                  (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                                  (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) *
                                           4);
                          fVar41 = nextCrossingT[iVar30];
                          auVar125 = (undefined1  [56])0x0;
                          SVar223 = SampledSpectrum::operator*
                                              (&sigma_t,*(Float *)(this_01[9].values.nAlloc +
                                                                  (((long)voxel[2] *
                                                                    (long)*(int *)((long)&this_01[10
                                                  ].values.alloc.memoryResource + 4) +
                                                  (long)voxel[1]) *
                                                  (long)*(int *)&this_01[10].values.alloc.
                                                                 memoryResource + (long)voxel[0]) *
                                                  4));
                          auVar158._0_8_ = SVar223.values.values._8_8_;
                          auVar158._8_56_ = auVar194;
                          auVar84._0_8_ = SVar223.values.values._0_8_;
                          auVar84._8_56_ = auVar125;
                          auVar195 = ZEXT1664(auVar84._0_16_);
                          sigma_maj.values.values =
                               (array<float,_4>)vmovlhps_avx(auVar84._0_16_,auVar158._0_16_);
                          if (SVar223.values.values[0] <= 0.0) {
                            auVar195 = ZEXT464((uint)local_568._0_4_);
                          }
                          else {
                            fVar43 = (float)local_5e8._0_4_;
                            while( true ) {
                              local_5e8._0_4_ = fVar43;
                              FVar42 = InvertExponentialSample(fVar41 - fVar43,auVar195._0_4_);
                              if (FVar42 <= (float)local_568._0_4_) break;
                              auVar125 = SUB6056((undefined1  [60])0x0,4);
                              FVar42 = SampleExponential((Float)local_568._0_4_,
                                                         sigma_maj.values.values[0]);
                              auVar37 = auVar217._0_16_;
                              auVar39 = auVar208._0_16_;
                              fVar126 = FVar42 + fVar43;
                              auVar194 = (undefined1  [56])0x0;
                              if (tMax <= fVar126) {
                                SampledSpectrum::SampledSpectrum((SampledSpectrum *)&intr_1,1.0);
                                pIVar16 = local_348;
                                IVar17 = intr_1.super_Interaction.pi.
                                         super_Point3<pbrt::Interval<float>_>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
                                local_360 = 0;
                                *local_348 = intr_1.super_Interaction.pi.
                                             super_Point3<pbrt::Interval<float>_>.
                                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
                                pIVar16[1] = IVar17;
                                SampleLd::anon_class_32_4_b07b4888::operator()
                                          ((anon_class_32_4_b07b4888 *)&sigma_a_1,
                                           (MediumSample *)&local_3f8.__align);
                                goto LAB_004377f4;
                              }
                              local_558._0_4_ = fVar126;
                              PVar221 = Ray::operator()(&ray,fVar126);
                              local_548.z = PVar221.super_Tuple3<pbrt::Point3,_float>.z;
                              auVar85._0_8_ = PVar221.super_Tuple3<pbrt::Point3,_float>._0_8_;
                              auVar85._8_56_ = auVar194;
                              local_548._0_8_ = vmovlps_avx(auVar85._0_16_);
                              SVar223 = SampledSpectrum::operator-(&sigma_maj);
                              auVar159._0_8_ = SVar223.values.values._8_8_;
                              auVar159._8_56_ = auVar125;
                              auVar86._0_8_ = SVar223.values.values._0_8_;
                              auVar86._8_56_ = auVar194;
                              intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
                                   vmovlhps_avx(auVar86._0_16_,auVar159._0_16_);
                              auVar194 = (undefined1  [56])0x0;
                              SVar223 = SampledSpectrum::operator*
                                                  ((SampledSpectrum *)&intr_1,
                                                   (float)local_558._0_4_ - fVar43);
                              auVar160._0_8_ = SVar223.values.values._8_8_;
                              auVar160._8_56_ = auVar125;
                              auVar87._0_8_ = SVar223.values.values._0_8_;
                              auVar87._8_56_ = auVar194;
                              auVar38 = vmovlhps_avx(auVar87._0_16_,auVar160._0_16_);
                              auVar194 = ZEXT856(auVar38._8_8_);
                              local_3f8.__align = auVar38._0_8_;
                              local_3f8._8_4_ = auVar38._8_4_;
                              local_3f8._12_4_ = auVar38._12_4_;
                              SVar223 = FastExp((SampledSpectrum *)&local_3f8.__align);
                              auVar161._0_8_ = SVar223.values.values._8_8_;
                              auVar161._8_56_ = auVar125;
                              auVar88._0_8_ = SVar223.values.values._0_8_;
                              auVar88._8_56_ = auVar194;
                              local_5e8 = auVar88._0_16_;
                              local_568 = auVar161._0_16_;
                              SVar223 = UniformGridMediumProvider::Density
                                                  (*(UniformGridMediumProvider **)this_01,
                                                   (Point3f *)&local_548,local_5c0);
                              auVar162._0_8_ = SVar223.values.values._8_8_;
                              auVar162._8_56_ = auVar125;
                              auVar89._0_8_ = SVar223.values.values._0_8_;
                              auVar89._8_56_ = auVar194;
                              density.values.values =
                                   (array<float,_4>)vmovlhps_avx(auVar89._0_16_,auVar162._0_16_);
                              auVar194 = ZEXT856(density.values.values._8_8_);
                              SVar223 = UniformGridMediumProvider::Le
                                                  (*(UniformGridMediumProvider **)this_01,
                                                   (Point3f *)&local_548,local_5c0);
                              auVar163._0_8_ = SVar223.values.values._8_8_;
                              auVar163._8_56_ = auVar125;
                              auVar90._0_8_ = SVar223.values.values._0_8_;
                              auVar90._8_56_ = auVar194;
                              Le.values.values =
                                   (array<float,_4>)vmovlhps_avx(auVar90._0_16_,auVar163._0_16_);
                              auVar125 = ZEXT856(Le.values.values._8_8_);
                              PVar222 = Transform::operator()
                                                  ((Transform *)&this_01[6].values,
                                                   (Point3<float> *)&local_548);
                              uVar124 = auVar125._0_8_;
                              auVar193 = auVar163._4_12_;
                              local_460.z = PVar222.super_Tuple3<pbrt::Point3,_float>.z;
                              auVar91._0_8_ = PVar222.super_Tuple3<pbrt::Point3,_float>._0_8_;
                              auVar91._8_56_ = auVar125;
                              local_460._0_8_ = vmovlps_avx(auVar91._0_16_);
                              VVar220 = Normalize<float>(&lightRay.d);
                              auVar46._0_8_ =
                                   VVar220.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                                   0x8000000080000000;
                              auVar46._8_4_ = (uint)uVar124 ^ 0x80000000;
                              auVar46._12_4_ = (uint)((ulong)uVar124 >> 0x20) ^ 0x80000000;
                              local_470.z = -VVar220.super_Tuple3<pbrt::Vector3,_float>.z;
                              auVar127._0_8_ =
                                   CONCAT44(auVar193._0_4_,
                                            VVar220.super_Tuple3<pbrt::Vector3,_float>.z) ^
                                   0x8000000080000000;
                              auVar127._8_4_ = auVar193._4_4_ ^ 0x80000000;
                              auVar127._12_4_ = auVar193._8_4_ ^ 0x80000000;
                              auVar194 = ZEXT856(auVar127._8_8_);
                              local_470._0_8_ = vmovlps_avx(auVar46);
                              auVar125 = (undefined1  [56])0x0;
                              local_5b4 = lightRay.time;
                              SVar223 = SampledSpectrum::operator*(&sigma_a,&density);
                              auVar164._0_8_ = SVar223.values.values._8_8_;
                              auVar164._8_56_ = auVar194;
                              auVar92._0_8_ = SVar223.values.values._0_8_;
                              auVar92._8_56_ = auVar125;
                              auVar38 = vmovlhps_avx(auVar92._0_16_,auVar164._0_16_);
                              auVar125 = ZEXT856(auVar38._8_8_);
                              local_3f8.__align = auVar38._0_8_;
                              local_3f8._8_4_ = auVar38._8_4_;
                              local_3f8._12_4_ = auVar38._12_4_;
                              SVar223 = SampledSpectrum::operator*(&sigma_s,&density);
                              auVar165._0_8_ = SVar223.values.values._8_8_;
                              auVar165._8_56_ = auVar194;
                              auVar93._0_8_ = SVar223.values.values._0_8_;
                              auVar93._8_56_ = auVar125;
                              local_288.values.values =
                                   (array<float,_4>)vmovlhps_avx(auVar93._0_16_,auVar165._0_16_);
                              local_478 = MVar15.
                                          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                                          .bits;
                              local_480.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                                   (TaggedPointer<pbrt::HGPhaseFunction>)
                                   (TaggedPointer<pbrt::HGPhaseFunction>)
                                   ((ulong)((long)&this_01[2].values.nStored + 4U) | 0x1000000000000
                                   );
                              MediumInteraction::MediumInteraction
                                        (&intr_1,(Point3f *)&local_460,(Vector3f *)&local_470,
                                         local_5b4,(SampledSpectrum *)&local_3f8.__align,&local_288,
                                         &sigma_maj,&Le,(MediumHandle *)&local_478,&local_480);
                              local_360 = 1;
                              local_3f8._64_8_ = intr_1.super_Interaction.mediumInterface;
                              local_3f8.__align =
                                   (anon_struct_8_0_00000001_for___align)
                                   intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
                              local_3f8._8_4_ =
                                   intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
                              local_3f8._12_4_ =
                                   intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
                              local_3f8._16_4_ =
                                   intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
                              local_3f8._20_4_ =
                                   intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
                              local_3f8._24_4_ = intr_1.super_Interaction.time;
                              local_3f8._28_4_ =
                                   intr_1.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
                              local_3f8._32_4_ =
                                   intr_1.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
                              local_3f8._36_4_ =
                                   intr_1.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
                              local_3f8._40_4_ =
                                   intr_1.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
                              local_3f8._44_4_ =
                                   intr_1.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
                              local_3f8._48_4_ =
                                   intr_1.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
                              local_3f8._52_4_ =
                                   intr_1.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
                              local_3f8._56_8_ = intr_1.super_Interaction._56_8_;
                              local_3f8._72_8_ =
                                   intr_1.super_Interaction.medium.
                                   super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                                   .bits;
                              local_3f8._80_8_ =
                                   intr_1.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits;
                              local_3f8._88_16_ = (undefined1  [16])intr_1.sigma_a.values.values;
                              local_3f8._104_16_ = (undefined1  [16])intr_1.sigma_s.values.values;
                              local_3f8._120_16_ = (undefined1  [16])intr_1.sigma_maj.values.values;
                              local_3f8._136_16_ = (undefined1  [16])intr_1.Le.values.values;
                              local_358 = vunpcklpd_avx(local_5e8,local_568);
                              auVar125 = ZEXT856((ulong)intr_1.phase.
                                                        super_TaggedPointer<pbrt::HGPhaseFunction>.
                                                        bits);
                              auVar208 = ZEXT1664(auVar39);
                              auVar217 = ZEXT1664(auVar37);
                              bVar18 = SampleLd::anon_class_32_4_b07b4888::operator()
                                                 ((anon_class_32_4_b07b4888 *)&sigma_a_1,
                                                  (MediumSample *)&local_3f8.__align);
                              pstd::optional<pbrt::MediumInteraction>::~optional
                                        ((optional<pbrt::MediumInteraction> *)&local_3f8.__align);
                              if (!bVar18) goto LAB_004376c2;
                              fVar43 = RNG::Uniform<float>(&rng);
                              local_568._0_4_ = fVar43;
                              auVar195 = ZEXT464((uint)sigma_maj.values.values[0]);
                              fVar43 = (float)local_558._0_4_;
                            }
                            auVar39 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                                 ZEXT416((uint)(((float)local_568._0_4_ - FVar42) /
                                                               (1.0 - FVar42))));
                            auVar195 = ZEXT1664(auVar39);
                          }
                          auVar125 = auVar195._8_56_;
                          if ((tMax < fVar41) ||
                             (iVar28 = voxel[iVar30], voxel[iVar30] = iVar28 + step[iVar30],
                             iVar28 + step[iVar30] == voxelLimit[iVar30])) break;
                          local_568._0_4_ = auVar195._0_4_;
                          local_5e8._0_4_ = fVar41;
                          nextCrossingT[iVar30] = fVar41 + deltaT[iVar30];
                        }
                      }
                    }
                    else {
                      stack0xfffffffffffffa70 = &pdfLight;
                      local_598._0_8_ = &throughput;
                      local_588 = (undefined1  [8])&pdfUni;
                      local_580 = &rng;
                      local_568._0_4_ = lightRay.d.super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar194 = (undefined1  [56])0x0;
                      local_5b4 = lightRay.d.super_Tuple3<pbrt::Vector3,_float>.z;
                      VVar220 = Normalize<float>(&lightRay.d);
                      ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
                           VVar220.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar66._0_8_ = VVar220.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                      auVar66._8_56_ = auVar194;
                      ray.o.super_Tuple3<pbrt::Point3,_float>.z =
                           lightRay.o.super_Tuple3<pbrt::Point3,_float>.z;
                      ray.o.super_Tuple3<pbrt::Point3,_float>.x =
                           lightRay.o.super_Tuple3<pbrt::Point3,_float>.x;
                      ray.o.super_Tuple3<pbrt::Point3,_float>.y =
                           lightRay.o.super_Tuple3<pbrt::Point3,_float>.y;
                      uVar124 = vmovlps_avx(auVar66._0_16_);
                      ray.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar124;
                      ray.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar124 >> 0x20);
                      ray.time = 0.0;
                      ray.medium.
                      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                               )0;
                      auVar194 = (undefined1  [56])0x0;
                      local_558._0_4_ = this_01[3].lambda_min;
                      SVar223 = DenselySampledSpectrum::Sample(this_01,local_5c0);
                      auVar144._0_8_ = SVar223.values.values._8_8_;
                      auVar144._8_56_ = auVar125;
                      auVar67._0_8_ = SVar223.values.values._0_8_;
                      auVar67._8_56_ = auVar194;
                      auVar39 = vmovlhps_avx(auVar67._0_16_,auVar144._0_16_);
                      local_3f8.__align = auVar39._0_8_;
                      local_3f8._8_4_ = auVar39._8_4_;
                      local_3f8._12_4_ = auVar39._12_4_;
                      auVar194 = (undefined1  [56])0x0;
                      SVar223 = SampledSpectrum::operator*
                                          ((SampledSpectrum *)&local_3f8.__align,
                                           (Float)local_558._0_4_);
                      auVar145._0_8_ = SVar223.values.values._8_8_;
                      auVar145._8_56_ = auVar125;
                      auVar68._0_8_ = SVar223.values.values._0_8_;
                      auVar68._8_56_ = auVar194;
                      sigma_a_1.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar68._0_16_,auVar145._0_16_);
                      auVar194 = (undefined1  [56])0x0;
                      local_558._0_4_ = this_01[3].lambda_min;
                      SVar223 = DenselySampledSpectrum::Sample(this_01 + 1,local_5c0);
                      auVar146._0_8_ = SVar223.values.values._8_8_;
                      auVar146._8_56_ = auVar125;
                      auVar69._0_8_ = SVar223.values.values._0_8_;
                      auVar69._8_56_ = auVar194;
                      auVar39 = vmovlhps_avx(auVar69._0_16_,auVar146._0_16_);
                      local_3f8.__align = auVar39._0_8_;
                      local_3f8._8_4_ = auVar39._8_4_;
                      local_3f8._12_4_ = auVar39._12_4_;
                      auVar194 = (undefined1  [56])0x0;
                      SVar223 = SampledSpectrum::operator*
                                          ((SampledSpectrum *)&local_3f8.__align,
                                           (Float)local_558._0_4_);
                      auVar147._0_8_ = SVar223.values.values._8_8_;
                      auVar147._8_56_ = auVar125;
                      auVar70._0_8_ = SVar223.values.values._0_8_;
                      auVar70._8_56_ = auVar194;
                      sigma_a.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar70._0_16_,auVar147._0_16_);
                      auVar194 = ZEXT856(sigma_a.values.values._8_8_);
                      SVar223 = SampledSpectrum::operator+(&sigma_a_1,&sigma_a);
                      auVar148._0_8_ = SVar223.values.values._8_8_;
                      auVar148._8_56_ = auVar125;
                      auVar71._0_8_ = SVar223.values.values._0_8_;
                      auVar71._8_56_ = auVar194;
                      sigma_s.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar71._0_16_,auVar148._0_16_);
                      auVar125 = ZEXT856(sigma_s.values.values._8_8_);
                      if ((SVar223.values.values[0] != 0.0) || (NAN(SVar223.values.values[0]))) {
                        local_558 = auVar71._0_16_;
                        fVar43 = RNG::Uniform<float>(&rng);
                        auVar72._0_4_ = SampleExponential(fVar43,(Float)local_558._0_4_);
                        auVar38 = auVar217._0_16_;
                        auVar37 = auVar208._0_16_;
                        auVar72._4_60_ = extraout_var;
                        auVar39 = vfmadd213ss_fma(ZEXT416((uint)local_568._0_4_),
                                                  ZEXT416((uint)local_568._0_4_),
                                                  ZEXT416((uint)(fVar41 * fVar41)));
                        auVar125 = ZEXT856(auVar39._8_8_);
                        auVar39 = vfmadd213ss_fma(ZEXT416((uint)local_5b4),ZEXT416((uint)local_5b4),
                                                  auVar39);
                        auVar39 = vsqrtss_avx(auVar39,auVar39);
                        fVar41 = auVar39._0_4_ * FVar42;
                        if (fVar41 <= auVar72._0_4_) {
                          auVar39._8_4_ = 0x80000000;
                          auVar39._0_8_ = 0x8000000080000000;
                          auVar39._12_4_ = 0x80000000;
                          auVar39 = vxorps_avx512vl(ZEXT416((uint)fVar41),auVar39);
                          auVar194 = ZEXT856(auVar39._8_8_);
                          SVar223 = SampledSpectrum::operator*(&sigma_s,auVar39._0_4_);
                          auVar182._0_8_ = SVar223.values.values._8_8_;
                          auVar182._8_56_ = auVar125;
                          auVar113._0_8_ = SVar223.values.values._0_8_;
                          auVar113._8_56_ = auVar194;
                          intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
                               vmovlhps_avx(auVar113._0_16_,auVar182._0_16_);
                          auVar194 = ZEXT856(intr_1.super_Interaction.pi.
                                             super_Point3<pbrt::Interval<float>_>.
                                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y);
                          SVar223 = FastExp((SampledSpectrum *)&intr_1);
                          auVar183._0_8_ = SVar223.values.values._8_8_;
                          auVar183._8_56_ = auVar125;
                          auVar114._0_8_ = SVar223.values.values._0_8_;
                          auVar114._8_56_ = auVar194;
                          local_358 = vmovlhps_avx(auVar114._0_16_,auVar183._0_16_);
                          local_360 = 0;
                          SampleLd::anon_class_32_4_b07b4888::operator()
                                    ((anon_class_32_4_b07b4888 *)local_598,
                                     (MediumSample *)&local_3f8.__align);
                        }
                        else {
                          auVar11._8_4_ = 0x80000000;
                          auVar11._0_8_ = 0x8000000080000000;
                          auVar11._12_4_ = 0x80000000;
                          auVar39 = vxorps_avx512vl(auVar72._0_16_,auVar11);
                          auVar194 = ZEXT856(auVar39._8_8_);
                          SVar223 = SampledSpectrum::operator*(&sigma_s,auVar39._0_4_);
                          auVar149._0_8_ = SVar223.values.values._8_8_;
                          auVar149._8_56_ = auVar125;
                          auVar73._0_8_ = SVar223.values.values._0_8_;
                          auVar73._8_56_ = auVar194;
                          auVar39 = vmovlhps_avx(auVar73._0_16_,auVar149._0_16_);
                          auVar194 = ZEXT856(auVar39._8_8_);
                          local_3f8.__align = auVar39._0_8_;
                          local_3f8._8_4_ = auVar39._8_4_;
                          local_3f8._12_4_ = auVar39._12_4_;
                          SVar223 = FastExp((SampledSpectrum *)&local_3f8.__align);
                          auVar150._0_8_ = SVar223.values.values._8_8_;
                          auVar150._8_56_ = auVar125;
                          auVar74._0_8_ = SVar223.values.values._0_8_;
                          auVar74._8_56_ = auVar194;
                          local_558 = auVar74._0_16_;
                          local_568 = auVar150._0_16_;
                          SVar223 = DenselySampledSpectrum::Sample(this_01 + 2,local_5c0);
                          auVar151._0_8_ = SVar223.values.values._8_8_;
                          auVar151._8_56_ = auVar125;
                          auVar75._0_8_ = SVar223.values.values._0_8_;
                          auVar75._8_56_ = auVar194;
                          local_5e8._8_8_ = extraout_var._4_8_;
                          sigma_t.values.values =
                               (array<float,_4>)vmovlhps_avx(auVar75._0_16_,auVar151._0_16_);
                          auVar125 = ZEXT856((ulong)local_5e8._8_8_);
                          PVar221 = Ray::operator()(&ray,auVar72._0_4_);
                          local_3f8._8_4_ = PVar221.super_Tuple3<pbrt::Point3,_float>.z;
                          auVar76._0_8_ = PVar221.super_Tuple3<pbrt::Point3,_float>._0_8_;
                          auVar76._8_56_ = auVar125;
                          local_3f8.__align =
                               (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar76._0_16_);
                          uVar35 = (ulong)&this_01[3].lambda_max | 0x1000000000000;
                          density.values.values[0] = (float)(int)((ulong)this_01 | 0x1000000000000);
                          density.values.values[1] =
                               (float)(int)(((ulong)this_01 | 0x1000000000000) >> 0x20);
                          Le.values.values[0] = (float)(int)uVar35;
                          Le.values.values[1] = (float)(int)(uVar35 >> 0x20);
                          auVar45._0_8_ =
                               CONCAT44(ray.d.super_Tuple3<pbrt::Vector3,_float>.y,
                                        ray.d.super_Tuple3<pbrt::Vector3,_float>.x) ^
                               0x8000000080000000;
                          auVar45._8_4_ = 0x80000000;
                          auVar45._12_4_ = 0x80000000;
                          uVar124 = vmovlps_avx(auVar45);
                          sigma_maj.values.values[2] = -ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
                          sigma_maj.values.values[0] = (float)(int)uVar124;
                          sigma_maj.values.values[1] = (float)(int)((ulong)uVar124 >> 0x20);
                          MediumInteraction::MediumInteraction
                                    (&intr_1,(Point3f *)&local_3f8.__align,(Vector3f *)&sigma_maj,
                                     lightRay.time,&sigma_a_1,&sigma_a,&sigma_s,&sigma_t,
                                     (MediumHandle *)&density,(PhaseFunctionHandle *)&Le);
                          local_360 = 1;
                          local_3f8._64_8_ = intr_1.super_Interaction.mediumInterface;
                          local_3f8.__align =
                               (anon_struct_8_0_00000001_for___align)
                               intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
                          local_3f8._8_4_ =
                               intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
                          local_3f8._12_4_ =
                               intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
                          local_3f8._16_4_ =
                               intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
                          local_3f8._20_4_ =
                               intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
                          local_3f8._24_4_ = intr_1.super_Interaction.time;
                          local_3f8._28_4_ =
                               intr_1.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
                          local_3f8._32_4_ =
                               intr_1.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
                          local_3f8._36_4_ =
                               intr_1.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
                          local_3f8._40_4_ =
                               intr_1.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
                          local_3f8._44_4_ =
                               intr_1.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
                          local_3f8._48_4_ =
                               intr_1.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
                          local_3f8._52_4_ =
                               intr_1.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
                          local_3f8._56_8_ = intr_1.super_Interaction._56_8_;
                          local_3f8._72_8_ =
                               intr_1.super_Interaction.medium.
                               super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                               .bits;
                          local_3f8._80_8_ =
                               intr_1.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits;
                          local_3f8._88_16_ = (undefined1  [16])intr_1.sigma_a.values.values;
                          local_3f8._104_16_ = (undefined1  [16])intr_1.sigma_s.values.values;
                          local_3f8._120_16_ = (undefined1  [16])intr_1.sigma_maj.values.values;
                          local_3f8._136_16_ = (undefined1  [16])intr_1.Le.values.values;
                          local_358 = vunpcklpd_avx(local_558,local_568);
                          auVar125 = ZEXT856((ulong)intr_1.phase.
                                                    super_TaggedPointer<pbrt::HGPhaseFunction>.bits)
                          ;
                          auVar208 = ZEXT1664(auVar37);
                          auVar217 = ZEXT1664(auVar38);
                          SampleLd::anon_class_32_4_b07b4888::operator()
                                    ((anon_class_32_4_b07b4888 *)local_598,
                                     (MediumSample *)&local_3f8.__align);
                          local_5e8 = auVar72._0_16_;
                        }
LAB_004377f4:
                        pstd::optional<pbrt::MediumInteraction>::~optional
                                  ((optional<pbrt::MediumInteraction> *)&local_3f8.__align);
                      }
                    }
                  }
                  else if (((ulong)lightRay.medium.
                                   super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                                   .bits & 0xfffe000000000000) == 0x2000000000000) {
                    sigma_a_1.values.values._8_8_ = &pdfLight;
                    sigma_a_1.values.values._0_8_ = &throughput;
                    auVar39 = vfmadd231ss_fma(ZEXT416((uint)(lightRay.d.
                                                             super_Tuple3<pbrt::Vector3,_float>.y *
                                                            lightRay.d.
                                                            super_Tuple3<pbrt::Vector3,_float>.y)),
                                              ZEXT416((uint)lightRay.d.
                                                            super_Tuple3<pbrt::Vector3,_float>.x),
                                              ZEXT416((uint)lightRay.d.
                                                            super_Tuple3<pbrt::Vector3,_float>.x));
                    auVar125 = ZEXT856(auVar39._8_8_);
                    auVar39 = vfmadd213ss_fma(ZEXT416((uint)lightRay.d.
                                                            super_Tuple3<pbrt::Vector3,_float>.z),
                                              ZEXT416((uint)lightRay.d.
                                                            super_Tuple3<pbrt::Vector3,_float>.z),
                                              auVar39);
                    auVar39 = vsqrtss_avx(auVar39,auVar39);
                    local_5c4 = FVar42 * auVar39._0_4_;
                    auVar194 = (undefined1  [56])0x0;
                    VVar220 = Normalize<float>(&lightRay.d);
                    local_3f8._20_4_ = VVar220.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar58._0_8_ = VVar220.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar58._8_56_ = auVar194;
                    local_3f8._4_4_ = lightRay.o.super_Tuple3<pbrt::Point3,_float>.y;
                    local_3f8._0_4_ = lightRay.o.super_Tuple3<pbrt::Point3,_float>.x;
                    local_3f8._8_4_ = lightRay.o.super_Tuple3<pbrt::Point3,_float>.z;
                    uVar124 = vmovlps_avx(auVar58._0_16_);
                    local_3f8._12_4_ = (undefined4)uVar124;
                    local_3f8._16_4_ = (undefined4)((ulong)uVar124 >> 0x20);
                    local_3f8._24_4_ = 0.0;
                    local_3f8._32_8_ = 0;
                    Transform::operator()
                              (&ray,(Transform *)(this_01 + 3),(Ray *)&local_3f8.__align,&local_5c4)
                    ;
                    bVar18 = Bounds3<float>::IntersectP
                                       ((Bounds3<float> *)&this_01->values,&ray.o,&ray.d,local_5c4,
                                        &tMin,&tMax);
                    auVar39 = auVar208._0_16_;
                    if (bVar18) {
                      FVar42 = *(Float *)&this_01[2].values.nStored;
                      auVar194 = (undefined1  [56])0x0;
                      SVar223 = DenselySampledSpectrum::Sample
                                          ((DenselySampledSpectrum *)&(this_01->values).nStored,
                                           local_5c0);
                      auVar138._0_8_ = SVar223.values.values._8_8_;
                      auVar138._8_56_ = auVar125;
                      auVar59._0_8_ = SVar223.values.values._0_8_;
                      auVar59._8_56_ = auVar194;
                      auVar37 = vmovlhps_avx(auVar59._0_16_,auVar138._0_16_);
                      local_3f8.__align = auVar37._0_8_;
                      local_3f8._8_4_ = auVar37._8_4_;
                      local_3f8._12_4_ = auVar37._12_4_;
                      auVar194 = (undefined1  [56])0x0;
                      SVar223 = SampledSpectrum::operator*
                                          ((SampledSpectrum *)&local_3f8.__align,FVar42);
                      auVar139._0_8_ = SVar223.values.values._8_8_;
                      auVar139._8_56_ = auVar125;
                      auVar60._0_8_ = SVar223.values.values._0_8_;
                      auVar60._8_56_ = auVar194;
                      sigma_a.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar60._0_16_,auVar139._0_16_);
                      FVar42 = *(Float *)&this_01[2].values.nStored;
                      auVar194 = (undefined1  [56])0x0;
                      SVar223 = DenselySampledSpectrum::Sample
                                          ((DenselySampledSpectrum *)&this_01[1].values.nStored,
                                           local_5c0);
                      auVar140._0_8_ = SVar223.values.values._8_8_;
                      auVar140._8_56_ = auVar125;
                      auVar61._0_8_ = SVar223.values.values._0_8_;
                      auVar61._8_56_ = auVar194;
                      auVar37 = vmovlhps_avx(auVar61._0_16_,auVar140._0_16_);
                      local_3f8.__align = auVar37._0_8_;
                      local_3f8._8_4_ = auVar37._8_4_;
                      local_3f8._12_4_ = auVar37._12_4_;
                      auVar194 = (undefined1  [56])0x0;
                      SVar223 = SampledSpectrum::operator*
                                          ((SampledSpectrum *)&local_3f8.__align,FVar42);
                      auVar141._0_8_ = SVar223.values.values._8_8_;
                      auVar141._8_56_ = auVar125;
                      auVar62._0_8_ = SVar223.values.values._0_8_;
                      auVar62._8_56_ = auVar194;
                      sigma_s.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar62._0_16_,auVar141._0_16_);
                      auVar194 = ZEXT856(sigma_s.values.values._8_8_);
                      SVar223 = SampledSpectrum::operator+(&sigma_a,&sigma_s);
                      auVar142._0_8_ = SVar223.values.values._8_8_;
                      auVar142._8_56_ = auVar125;
                      auVar63._0_8_ = SVar223.values.values._0_8_;
                      auVar63._8_56_ = auVar194;
                      sigma_t.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar63._0_16_,auVar142._0_16_);
                      auVar125 = ZEXT856(sigma_t.values.values._8_8_);
                      VVar220 = Bounds3<float>::Diagonal((Bounds3<float> *)&this_01->values);
                      auVar143._4_60_ = auVar142._4_60_;
                      auVar143._0_4_ = VVar220.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar64._0_8_ = VVar220.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                      auVar64._8_56_ = auVar125;
                      auVar199._4_4_ = ray.o.super_Tuple3<pbrt::Point3,_float>.z;
                      auVar199._0_4_ = ray.o.super_Tuple3<pbrt::Point3,_float>.y;
                      auVar199._8_8_ = 0;
                      auVar203._8_8_ = 0;
                      auVar203._0_8_ = *(ulong *)((long)&(this_01->values).alloc.memoryResource + 4)
                      ;
                      auVar37 = vsubps_avx(auVar199,auVar203);
                      auVar37 = vpermt2ps_avx512vl(auVar37,_DAT_00596440,
                                                   ZEXT416((uint)(ray.o.
                                                  super_Tuple3<pbrt::Point3,_float>.x -
                                                  *(float *)&(this_01->values).alloc.memoryResource)
                                                  ));
                      auVar37 = vinsertps_avx(auVar37,ZEXT416((uint)ray.d.
                                                  super_Tuple3<pbrt::Vector3,_float>.x),0x30);
                      auVar38 = vpermt2ps_avx512vl(auVar64._0_16_,_DAT_00596450,auVar143._0_16_);
                      auVar204._4_4_ = ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar204._0_4_ = ray.d.super_Tuple3<pbrt::Vector3,_float>.y;
                      auVar204._8_8_ = 0;
                      _local_598 = vdivps_avx(auVar37,auVar38);
                      auVar37 = vpermt2ps_avx512vl(auVar64._0_16_,ZEXT816(0x400000001),
                                                   auVar143._0_16_);
                      auVar37 = vdivps_avx(auVar204,auVar37);
                      local_588 = (undefined1  [8])vmovlps_avx(auVar37);
                      auVar125 = (undefined1  [56])0x0;
                      local_580 = (RNG *)((ulong)local_580 & 0xffffffff00000000);
                      local_578.
                      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                               )0;
                      PVar221 = Ray::operator()((Ray *)local_598,tMin);
                      fVar126 = PVar221.super_Tuple3<pbrt::Point3,_float>.z;
                      auVar65._0_8_ = PVar221.super_Tuple3<pbrt::Point3,_float>._0_8_;
                      auVar65._8_56_ = auVar125;
                      auVar37 = vpcmpeqd_avx(auVar39,auVar39);
                      ppfVar2 = &this_01[10].values.ptr;
                      auVar206 = ZEXT816(0) << 0x40;
                      lVar32 = 0;
                      local_558._0_8_ = ppfVar2;
                      iVar30 = *(int *)&this_01[10].values.ptr;
                      auVar200._8_8_ = 0;
                      auVar200._0_8_ = this_01[10].values.alloc.memoryResource;
                      auVar39 = vcvtdq2ps_avx(auVar200);
                      auVar37 = vpaddd_avx(auVar200,auVar37);
                      auVar37 = vcvtdq2ps_avx(auVar37);
                      fVar41 = auVar39._0_4_;
                      fVar43 = PVar221.super_Tuple3<pbrt::Point3,_float>.x;
                      auVar212._0_4_ = fVar43 * fVar41;
                      auVar212._4_4_ = PVar221.super_Tuple3<pbrt::Point3,_float>.y * auVar39._4_4_;
                      auVar212._8_4_ = auVar125._0_4_ * auVar39._8_4_;
                      auVar212._12_4_ = auVar125._4_4_ * auVar39._12_4_;
                      auVar39 = vmovshdup_avx(auVar39);
                      fVar207 = 1.0 / fVar41;
                      auVar208 = ZEXT464((uint)fVar207);
                      auVar38 = vmovshdup_avx(auVar37);
                      uVar35 = vcmpps_avx512vl(auVar37,auVar212,1);
                      auVar205 = vmovshdup_avx(auVar212);
                      uVar124 = vcmpss_avx512f(auVar205,auVar206,1);
                      bVar12 = (byte)(uVar35 >> 1);
                      fVar196 = (float)iVar30;
                      uVar10 = vcmpss_avx512f(auVar212,auVar206,1);
                      iVar28 = (int)(float)((uint)!(bool)((byte)uVar124 & 1) *
                                           ((uint)(bVar12 & 1) * auVar38._0_4_ +
                                           (uint)!(bool)(bVar12 & 1) * auVar205._0_4_));
                      iVar29 = (int)(float)((uint)!(bool)((byte)uVar10 & 1) *
                                           ((uint)((byte)uVar35 & 1) * auVar37._0_4_ +
                                           (uint)!(bool)((byte)uVar35 & 1) * (int)auVar212._0_4_));
                      auVar213._0_4_ = (float)(iVar30 + -1);
                      auVar213._4_12_ = auVar217._4_12_;
                      fVar209 = auVar39._0_4_;
                      auVar39 = vminss_avx(auVar213,ZEXT416((uint)(fVar126 * fVar196)));
                      uVar124 = vcmpss_avx512f(ZEXT416((uint)(fVar126 * fVar196)),auVar206,1);
                      auVar37 = vmovshdup_avx(auVar65._0_16_);
                      iVar30 = (int)(float)((uint)!(bool)((byte)uVar124 & 1) * auVar39._0_4_);
                      local_5e8._0_4_ = tMin;
                      for (; lVar32 != 3; lVar32 = lVar32 + 1) {
                        pfVar23 = (float *)(local_598 + 0xc);
                        iVar31 = (int)lVar32;
                        if ((iVar31 != 0) && (pfVar23 = (float *)local_588, iVar31 != 1)) {
                          pfVar23 = (float *)((long)local_588 + 4);
                        }
                        if ((*pfVar23 == 0.0) && (!NAN(*pfVar23))) {
                          puVar24 = (undefined8 *)(local_598 + 0xc);
                          if ((iVar31 != 0) && (puVar24 = (undefined8 *)local_588, iVar31 != 1)) {
                            puVar24 = (undefined8 *)((long)local_588 + 4);
                          }
                          *(undefined4 *)puVar24 = 0;
                        }
                        if (iVar31 == 1) {
                          voxel[1] = iVar28;
                          piVar33 = voxelLimit + 1;
                          piVar34 = step + 1;
                          pfVar26 = deltaT + 1;
                          pfVar23 = nextCrossingT + 1;
                          pfVar25 = (float *)local_588;
                          iVar27 = iVar28;
                        }
                        else if (iVar31 == 0) {
                          voxel[lVar32] = iVar29;
                          piVar33 = voxelLimit;
                          piVar34 = step;
                          pfVar26 = deltaT;
                          pfVar23 = nextCrossingT;
                          pfVar25 = (float *)(local_598 + 0xc);
                          iVar27 = iVar29;
                        }
                        else {
                          piVar33 = voxelLimit + 2;
                          piVar34 = step + 2;
                          pfVar26 = deltaT + 2;
                          pfVar23 = nextCrossingT + 2;
                          pfVar25 = (float *)((long)local_588 + 4);
                          voxel[lVar32] = iVar30;
                          iVar27 = iVar30;
                        }
                        if (0.0 <= *pfVar25) {
                          pfVar25 = (float *)(local_598 + 0xc);
                          pvVar36 = &this_01[10].values;
                          fVar216 = fVar41;
                          fVar218 = fVar43;
                          fVar219 = fVar207;
                          if (iVar31 != 0) {
                            pfVar25 = (float *)local_588;
                            pvVar36 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                      ((long)&this_01[10].values.alloc.memoryResource + 4);
                            fVar216 = fVar209;
                            fVar218 = auVar37._0_4_;
                            fVar219 = 1.0 / fVar209;
                            if (iVar31 != 1) {
                              pfVar25 = (float *)((long)local_588 + 4);
                              pvVar36 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                        ppfVar2;
                              fVar216 = fVar196;
                              fVar218 = fVar126;
                              fVar219 = 1.0 / fVar196;
                            }
                          }
                          *piVar34 = 1;
                          auVar39 = vcvtsi2ss_avx512f(in_XMM16,iVar27 + 1);
                          fVar4 = *pfVar25;
                          *pfVar26 = fVar219 / fVar4;
                          *pfVar23 = (auVar39._0_4_ / fVar216 - fVar218) / fVar4 + tMin;
                          iVar31 = *(int *)&(pvVar36->alloc).memoryResource;
                        }
                        else {
                          pfVar25 = (float *)(local_598 + 0xc);
                          fVar216 = fVar41;
                          fVar218 = fVar43;
                          fVar219 = -fVar207;
                          if (iVar31 != 0) {
                            pfVar25 = (float *)local_588;
                            fVar216 = fVar209;
                            fVar218 = auVar37._0_4_;
                            fVar219 = -(1.0 / fVar209);
                            if (iVar31 != 1) {
                              pfVar25 = (float *)((long)local_588 + 4);
                              fVar216 = fVar196;
                              fVar218 = fVar126;
                              fVar219 = -(1.0 / fVar196);
                            }
                          }
                          auVar39 = vcvtsi2ss_avx512f(in_XMM16,iVar27);
                          *piVar34 = -1;
                          fVar4 = *pfVar25;
                          *pfVar26 = fVar219 / fVar4;
                          *pfVar23 = (auVar39._0_4_ / fVar216 - fVar218) / fVar4 + tMin;
                          iVar31 = -1;
                        }
                        auVar217 = ZEXT464(0);
                        *piVar33 = iVar31;
                      }
                      fVar41 = RNG::Uniform<float>(&rng);
                      local_568._0_4_ = fVar41;
                      while( true ) {
                        auVar194 = (undefined1  [56])0x0;
                        iVar30 = *(int *)(&DAT_00596420 +
                                         (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                                (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                                (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4
                                         );
                        fVar41 = nextCrossingT[iVar30];
                        auVar125 = (undefined1  [56])0x0;
                        SVar223 = SampledSpectrum::operator*
                                            (&sigma_t,*(Float *)(this_01[9].values.nAlloc +
                                                                (((long)voxel[2] *
                                                                  (long)*(int *)((long)&this_01[10].
                                                                                        values.alloc
                                                                                        .
                                                  memoryResource + 4) + (long)voxel[1]) *
                                                  (long)*(int *)&this_01[10].values.alloc.
                                                                 memoryResource + (long)voxel[0]) *
                                                  4));
                        auVar166._0_8_ = SVar223.values.values._8_8_;
                        auVar166._8_56_ = auVar194;
                        auVar94._0_8_ = SVar223.values.values._0_8_;
                        auVar94._8_56_ = auVar125;
                        auVar195 = ZEXT1664(auVar94._0_16_);
                        sigma_maj.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar94._0_16_,auVar166._0_16_);
                        if (SVar223.values.values[0] <= 0.0) {
                          auVar195 = ZEXT464((uint)local_568._0_4_);
                        }
                        else {
                          fVar43 = (float)local_5e8._0_4_;
                          while( true ) {
                            local_5e8._0_4_ = fVar43;
                            FVar42 = InvertExponentialSample(fVar41 - fVar43,auVar195._0_4_);
                            if (FVar42 <= (float)local_568._0_4_) break;
                            auVar125 = SUB6056((undefined1  [60])0x0,4);
                            FVar42 = SampleExponential((Float)local_568._0_4_,
                                                       sigma_maj.values.values[0]);
                            auVar37 = auVar217._0_16_;
                            auVar39 = auVar208._0_16_;
                            fVar126 = FVar42 + fVar43;
                            auVar194 = (undefined1  [56])0x0;
                            if (tMax <= fVar126) {
                              SampledSpectrum::SampledSpectrum((SampledSpectrum *)&intr_1,1.0);
                              pIVar16 = local_348;
                              IVar17 = intr_1.super_Interaction.pi.
                                       super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
                              local_360 = 0;
                              *local_348 = intr_1.super_Interaction.pi.
                                           super_Point3<pbrt::Interval<float>_>.
                                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
                              pIVar16[1] = IVar17;
                              SampleLd::anon_class_32_4_b07b4888::operator()
                                        ((anon_class_32_4_b07b4888 *)&sigma_a_1,
                                         (MediumSample *)&local_3f8.__align);
                              goto LAB_004377f4;
                            }
                            local_558._0_4_ = fVar126;
                            PVar221 = Ray::operator()(&ray,fVar126);
                            local_548.z = PVar221.super_Tuple3<pbrt::Point3,_float>.z;
                            auVar95._0_8_ = PVar221.super_Tuple3<pbrt::Point3,_float>._0_8_;
                            auVar95._8_56_ = auVar194;
                            local_548._0_8_ = vmovlps_avx(auVar95._0_16_);
                            SVar223 = SampledSpectrum::operator-(&sigma_maj);
                            auVar167._0_8_ = SVar223.values.values._8_8_;
                            auVar167._8_56_ = auVar125;
                            auVar96._0_8_ = SVar223.values.values._0_8_;
                            auVar96._8_56_ = auVar194;
                            intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
                                 vmovlhps_avx(auVar96._0_16_,auVar167._0_16_);
                            auVar194 = (undefined1  [56])0x0;
                            SVar223 = SampledSpectrum::operator*
                                                ((SampledSpectrum *)&intr_1,
                                                 (float)local_558._0_4_ - fVar43);
                            auVar168._0_8_ = SVar223.values.values._8_8_;
                            auVar168._8_56_ = auVar125;
                            auVar97._0_8_ = SVar223.values.values._0_8_;
                            auVar97._8_56_ = auVar194;
                            auVar38 = vmovlhps_avx(auVar97._0_16_,auVar168._0_16_);
                            auVar194 = ZEXT856(auVar38._8_8_);
                            local_3f8.__align = auVar38._0_8_;
                            local_3f8._8_4_ = auVar38._8_4_;
                            local_3f8._12_4_ = auVar38._12_4_;
                            SVar223 = FastExp((SampledSpectrum *)&local_3f8.__align);
                            auVar169._0_8_ = SVar223.values.values._8_8_;
                            auVar169._8_56_ = auVar125;
                            auVar98._0_8_ = SVar223.values.values._0_8_;
                            auVar98._8_56_ = auVar194;
                            local_5e8 = auVar98._0_16_;
                            local_568 = auVar169._0_16_;
                            SVar223 = CloudMediumProvider::Density
                                                (*(CloudMediumProvider **)this_01,
                                                 (Point3f *)&local_548,local_5c0);
                            auVar170._0_8_ = SVar223.values.values._8_8_;
                            auVar170._8_56_ = auVar125;
                            auVar99._0_8_ = SVar223.values.values._0_8_;
                            auVar99._8_56_ = auVar194;
                            density.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar99._0_16_,auVar170._0_16_);
                            auVar194 = ZEXT856(density.values.values._8_8_);
                            SVar223 = CloudMediumProvider::Le
                                                (*(CloudMediumProvider **)this_01,
                                                 (Point3f *)&local_548,local_5c0);
                            auVar171._0_8_ = SVar223.values.values._8_8_;
                            auVar171._8_56_ = auVar125;
                            auVar100._0_8_ = SVar223.values.values._0_8_;
                            auVar100._8_56_ = auVar194;
                            Le.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar100._0_16_,auVar171._0_16_);
                            auVar125 = ZEXT856(Le.values.values._8_8_);
                            PVar222 = Transform::operator()
                                                ((Transform *)&this_01[6].values,
                                                 (Point3<float> *)&local_548);
                            uVar124 = auVar125._0_8_;
                            auVar193 = auVar171._4_12_;
                            local_460.z = PVar222.super_Tuple3<pbrt::Point3,_float>.z;
                            auVar101._0_8_ = PVar222.super_Tuple3<pbrt::Point3,_float>._0_8_;
                            auVar101._8_56_ = auVar125;
                            local_460._0_8_ = vmovlps_avx(auVar101._0_16_);
                            VVar220 = Normalize<float>(&lightRay.d);
                            auVar47._0_8_ =
                                 VVar220.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                                 0x8000000080000000;
                            auVar47._8_4_ = (uint)uVar124 ^ 0x80000000;
                            auVar47._12_4_ = (uint)((ulong)uVar124 >> 0x20) ^ 0x80000000;
                            local_470.z = -VVar220.super_Tuple3<pbrt::Vector3,_float>.z;
                            auVar128._0_8_ =
                                 CONCAT44(auVar193._0_4_,
                                          VVar220.super_Tuple3<pbrt::Vector3,_float>.z) ^
                                 0x8000000080000000;
                            auVar128._8_4_ = auVar193._4_4_ ^ 0x80000000;
                            auVar128._12_4_ = auVar193._8_4_ ^ 0x80000000;
                            auVar194 = ZEXT856(auVar128._8_8_);
                            local_470._0_8_ = vmovlps_avx(auVar47);
                            auVar125 = (undefined1  [56])0x0;
                            local_5b4 = lightRay.time;
                            SVar223 = SampledSpectrum::operator*(&sigma_a,&density);
                            auVar172._0_8_ = SVar223.values.values._8_8_;
                            auVar172._8_56_ = auVar194;
                            auVar102._0_8_ = SVar223.values.values._0_8_;
                            auVar102._8_56_ = auVar125;
                            auVar38 = vmovlhps_avx(auVar102._0_16_,auVar172._0_16_);
                            auVar125 = ZEXT856(auVar38._8_8_);
                            local_3f8.__align = auVar38._0_8_;
                            local_3f8._8_4_ = auVar38._8_4_;
                            local_3f8._12_4_ = auVar38._12_4_;
                            SVar223 = SampledSpectrum::operator*(&sigma_s,&density);
                            auVar173._0_8_ = SVar223.values.values._8_8_;
                            auVar173._8_56_ = auVar194;
                            auVar103._0_8_ = SVar223.values.values._0_8_;
                            auVar103._8_56_ = auVar125;
                            local_288.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar103._0_16_,auVar173._0_16_);
                            local_480.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                                 (TaggedPointer<pbrt::HGPhaseFunction>)
                                 (TaggedPointer<pbrt::HGPhaseFunction>)
                                 ((ulong)((long)&this_01[2].values.nStored + 4U) | 0x1000000000000);
                            local_478.bits =
                                 (ulong)MVar15.
                                        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                                        .bits | 0x3000000000000;
                            MediumInteraction::MediumInteraction
                                      (&intr_1,(Point3f *)&local_460,(Vector3f *)&local_470,
                                       local_5b4,(SampledSpectrum *)&local_3f8.__align,&local_288,
                                       &sigma_maj,&Le,(MediumHandle *)&local_478,&local_480);
                            local_360 = 1;
                            local_3f8._64_8_ = intr_1.super_Interaction.mediumInterface;
                            local_3f8.__align =
                                 (anon_struct_8_0_00000001_for___align)
                                 intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
                            local_3f8._8_4_ =
                                 intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
                            local_3f8._12_4_ =
                                 intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
                            local_3f8._16_4_ =
                                 intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
                            local_3f8._20_4_ =
                                 intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
                            local_3f8._24_4_ = intr_1.super_Interaction.time;
                            local_3f8._28_4_ =
                                 intr_1.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
                            local_3f8._32_4_ =
                                 intr_1.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
                            local_3f8._36_4_ =
                                 intr_1.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
                            local_3f8._40_4_ =
                                 intr_1.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
                            local_3f8._44_4_ =
                                 intr_1.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
                            local_3f8._48_4_ =
                                 intr_1.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
                            local_3f8._52_4_ =
                                 intr_1.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
                            local_3f8._56_8_ = intr_1.super_Interaction._56_8_;
                            local_3f8._72_8_ =
                                 intr_1.super_Interaction.medium.
                                 super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                                 .bits;
                            local_3f8._80_8_ =
                                 intr_1.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits;
                            local_3f8._88_16_ = (undefined1  [16])intr_1.sigma_a.values.values;
                            local_3f8._104_16_ = (undefined1  [16])intr_1.sigma_s.values.values;
                            local_3f8._120_16_ = (undefined1  [16])intr_1.sigma_maj.values.values;
                            local_3f8._136_16_ = (undefined1  [16])intr_1.Le.values.values;
                            local_358 = vunpcklpd_avx(local_5e8,local_568);
                            auVar125 = ZEXT856((ulong)intr_1.phase.
                                                      super_TaggedPointer<pbrt::HGPhaseFunction>.
                                                      bits);
                            auVar208 = ZEXT1664(auVar39);
                            auVar217 = ZEXT1664(auVar37);
                            bVar18 = SampleLd::anon_class_32_4_b07b4888::operator()
                                               ((anon_class_32_4_b07b4888 *)&sigma_a_1,
                                                (MediumSample *)&local_3f8.__align);
                            pstd::optional<pbrt::MediumInteraction>::~optional
                                      ((optional<pbrt::MediumInteraction> *)&local_3f8.__align);
                            if (!bVar18) goto LAB_004376c2;
                            fVar43 = RNG::Uniform<float>(&rng);
                            local_568._0_4_ = fVar43;
                            auVar195 = ZEXT464((uint)sigma_maj.values.values[0]);
                            fVar43 = (float)local_558._0_4_;
                          }
                          auVar39 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                               ZEXT416((uint)(((float)local_568._0_4_ - FVar42) /
                                                             (1.0 - FVar42))));
                          auVar195 = ZEXT1664(auVar39);
                        }
                        auVar125 = auVar195._8_56_;
                        if ((tMax < fVar41) ||
                           (iVar28 = voxel[iVar30], voxel[iVar30] = iVar28 + step[iVar30],
                           iVar28 + step[iVar30] == voxelLimit[iVar30])) break;
                        local_568._0_4_ = auVar195._0_4_;
                        local_5e8._0_4_ = fVar41;
                        nextCrossingT[iVar30] = fVar41 + deltaT[iVar30];
                      }
                    }
                  }
                  else {
                    sigma_a_1.values.values._8_8_ = &pdfLight;
                    sigma_a_1.values.values._0_8_ = &throughput;
                    auVar39 = vfmadd231ss_fma(ZEXT416((uint)(lightRay.d.
                                                             super_Tuple3<pbrt::Vector3,_float>.y *
                                                            lightRay.d.
                                                            super_Tuple3<pbrt::Vector3,_float>.y)),
                                              ZEXT416((uint)lightRay.d.
                                                            super_Tuple3<pbrt::Vector3,_float>.x),
                                              ZEXT416((uint)lightRay.d.
                                                            super_Tuple3<pbrt::Vector3,_float>.x));
                    auVar125 = ZEXT856(auVar39._8_8_);
                    auVar39 = vfmadd213ss_fma(ZEXT416((uint)lightRay.d.
                                                            super_Tuple3<pbrt::Vector3,_float>.z),
                                              ZEXT416((uint)lightRay.d.
                                                            super_Tuple3<pbrt::Vector3,_float>.z),
                                              auVar39);
                    auVar39 = vsqrtss_avx(auVar39,auVar39);
                    local_5c4 = FVar42 * auVar39._0_4_;
                    auVar194 = (undefined1  [56])0x0;
                    VVar220 = Normalize<float>(&lightRay.d);
                    local_3f8._20_4_ = VVar220.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar77._0_8_ = VVar220.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar77._8_56_ = auVar194;
                    local_3f8._4_4_ = lightRay.o.super_Tuple3<pbrt::Point3,_float>.y;
                    local_3f8._0_4_ = lightRay.o.super_Tuple3<pbrt::Point3,_float>.x;
                    local_3f8._8_4_ = lightRay.o.super_Tuple3<pbrt::Point3,_float>.z;
                    uVar124 = vmovlps_avx(auVar77._0_16_);
                    local_3f8._12_4_ = (undefined4)uVar124;
                    local_3f8._16_4_ = (undefined4)((ulong)uVar124 >> 0x20);
                    local_3f8._24_4_ = 0.0;
                    local_3f8._32_8_ = 0;
                    Transform::operator()
                              (&ray,(Transform *)(this_01 + 3),(Ray *)&local_3f8.__align,&local_5c4)
                    ;
                    bVar18 = Bounds3<float>::IntersectP
                                       ((Bounds3<float> *)&this_01->values,&ray.o,&ray.d,local_5c4,
                                        &tMin,&tMax);
                    auVar39 = auVar208._0_16_;
                    if (bVar18) {
                      FVar42 = *(Float *)&this_01[2].values.nStored;
                      auVar194 = (undefined1  [56])0x0;
                      SVar223 = DenselySampledSpectrum::Sample
                                          ((DenselySampledSpectrum *)&(this_01->values).nStored,
                                           local_5c0);
                      auVar152._0_8_ = SVar223.values.values._8_8_;
                      auVar152._8_56_ = auVar125;
                      auVar208._0_8_ = SVar223.values.values._0_8_;
                      auVar208._8_56_ = auVar194;
                      auVar37 = vmovlhps_avx(auVar208._0_16_,auVar152._0_16_);
                      local_3f8.__align = auVar37._0_8_;
                      local_3f8._8_4_ = auVar37._8_4_;
                      local_3f8._12_4_ = auVar37._12_4_;
                      auVar194 = (undefined1  [56])0x0;
                      SVar223 = SampledSpectrum::operator*
                                          ((SampledSpectrum *)&local_3f8.__align,FVar42);
                      auVar153._0_8_ = SVar223.values.values._8_8_;
                      auVar153._8_56_ = auVar125;
                      auVar78._0_8_ = SVar223.values.values._0_8_;
                      auVar78._8_56_ = auVar194;
                      sigma_a.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar78._0_16_,auVar153._0_16_);
                      FVar42 = *(Float *)&this_01[2].values.nStored;
                      auVar194 = (undefined1  [56])0x0;
                      SVar223 = DenselySampledSpectrum::Sample
                                          ((DenselySampledSpectrum *)&this_01[1].values.nStored,
                                           local_5c0);
                      auVar154._0_8_ = SVar223.values.values._8_8_;
                      auVar154._8_56_ = auVar125;
                      auVar79._0_8_ = SVar223.values.values._0_8_;
                      auVar79._8_56_ = auVar194;
                      auVar37 = vmovlhps_avx(auVar79._0_16_,auVar154._0_16_);
                      local_3f8.__align = auVar37._0_8_;
                      local_3f8._8_4_ = auVar37._8_4_;
                      local_3f8._12_4_ = auVar37._12_4_;
                      auVar194 = (undefined1  [56])0x0;
                      SVar223 = SampledSpectrum::operator*
                                          ((SampledSpectrum *)&local_3f8.__align,FVar42);
                      auVar155._0_8_ = SVar223.values.values._8_8_;
                      auVar155._8_56_ = auVar125;
                      auVar80._0_8_ = SVar223.values.values._0_8_;
                      auVar80._8_56_ = auVar194;
                      sigma_s.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar80._0_16_,auVar155._0_16_);
                      auVar194 = ZEXT856(sigma_s.values.values._8_8_);
                      SVar223 = SampledSpectrum::operator+(&sigma_a,&sigma_s);
                      auVar156._0_8_ = SVar223.values.values._8_8_;
                      auVar156._8_56_ = auVar125;
                      auVar81._0_8_ = SVar223.values.values._0_8_;
                      auVar81._8_56_ = auVar194;
                      sigma_t.values.values =
                           (array<float,_4>)vmovlhps_avx(auVar81._0_16_,auVar156._0_16_);
                      auVar125 = ZEXT856(sigma_t.values.values._8_8_);
                      VVar220 = Bounds3<float>::Diagonal((Bounds3<float> *)&this_01->values);
                      auVar157._4_60_ = auVar156._4_60_;
                      auVar157._0_4_ = VVar220.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar82._0_8_ = VVar220.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                      auVar82._8_56_ = auVar125;
                      auVar37._4_4_ = ray.o.super_Tuple3<pbrt::Point3,_float>.z;
                      auVar37._0_4_ = ray.o.super_Tuple3<pbrt::Point3,_float>.y;
                      auVar37._8_8_ = 0;
                      auVar205._8_8_ = 0;
                      auVar205._0_8_ = *(ulong *)((long)&(this_01->values).alloc.memoryResource + 4)
                      ;
                      auVar37 = vsubps_avx(auVar37,auVar205);
                      auVar37 = vpermt2ps_avx512vl(auVar37,_DAT_00596440,
                                                   ZEXT416((uint)(ray.o.
                                                  super_Tuple3<pbrt::Point3,_float>.x -
                                                  *(float *)&(this_01->values).alloc.memoryResource)
                                                  ));
                      auVar37 = vinsertps_avx(auVar37,ZEXT416((uint)ray.d.
                                                  super_Tuple3<pbrt::Vector3,_float>.x),0x30);
                      auVar38 = vpermt2ps_avx512vl(auVar82._0_16_,_DAT_00596450,auVar157._0_16_);
                      auVar206._4_4_ = ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar206._0_4_ = ray.d.super_Tuple3<pbrt::Vector3,_float>.y;
                      auVar206._8_8_ = 0;
                      _local_598 = vdivps_avx(auVar37,auVar38);
                      auVar37 = vpermt2ps_avx512vl(auVar82._0_16_,ZEXT816(0x400000001),
                                                   auVar157._0_16_);
                      auVar37 = vdivps_avx(auVar206,auVar37);
                      local_588 = (undefined1  [8])vmovlps_avx(auVar37);
                      auVar125 = (undefined1  [56])0x0;
                      local_580 = (RNG *)((ulong)local_580 & 0xffffffff00000000);
                      local_578.
                      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                               )0;
                      PVar221 = Ray::operator()((Ray *)local_598,tMin);
                      fVar126 = PVar221.super_Tuple3<pbrt::Point3,_float>.z;
                      auVar83._0_8_ = PVar221.super_Tuple3<pbrt::Point3,_float>._0_8_;
                      auVar83._8_56_ = auVar125;
                      auVar37 = vpcmpeqd_avx(auVar39,auVar39);
                      iVar30 = *(int *)&this_01[10].values.ptr;
                      auVar206 = ZEXT816(0) << 0x40;
                      lVar32 = 0;
                      auVar38._8_8_ = 0;
                      auVar38._0_8_ = this_01[10].values.alloc.memoryResource;
                      auVar39 = vcvtdq2ps_avx(auVar38);
                      auVar37 = vpaddd_avx(auVar38,auVar37);
                      auVar37 = vcvtdq2ps_avx(auVar37);
                      fVar41 = auVar39._0_4_;
                      fVar43 = PVar221.super_Tuple3<pbrt::Point3,_float>.x;
                      auVar214._0_4_ = fVar43 * fVar41;
                      auVar214._4_4_ = PVar221.super_Tuple3<pbrt::Point3,_float>.y * auVar39._4_4_;
                      auVar214._8_4_ = auVar125._0_4_ * auVar39._8_4_;
                      auVar214._12_4_ = auVar125._4_4_ * auVar39._12_4_;
                      auVar39 = vmovshdup_avx(auVar39);
                      fVar207 = 1.0 / fVar41;
                      auVar208 = ZEXT464((uint)fVar207);
                      auVar38 = vmovshdup_avx(auVar37);
                      uVar35 = vcmpps_avx512vl(auVar37,auVar214,1);
                      auVar205 = vmovshdup_avx(auVar214);
                      uVar124 = vcmpss_avx512f(auVar205,auVar206,1);
                      bVar12 = (byte)(uVar35 >> 1);
                      fVar196 = (float)iVar30;
                      uVar10 = vcmpss_avx512f(auVar214,auVar206,1);
                      iVar28 = (int)(float)((uint)!(bool)((byte)uVar124 & 1) *
                                           ((uint)(bVar12 & 1) * auVar38._0_4_ +
                                           (uint)!(bool)(bVar12 & 1) * auVar205._0_4_));
                      iVar29 = (int)(float)((uint)!(bool)((byte)uVar10 & 1) *
                                           ((uint)((byte)uVar35 & 1) * auVar37._0_4_ +
                                           (uint)!(bool)((byte)uVar35 & 1) * (int)auVar214._0_4_));
                      auVar215._0_4_ = (float)(iVar30 + -1);
                      auVar215._4_12_ = auVar217._4_12_;
                      fVar209 = auVar39._0_4_;
                      auVar39 = vminss_avx(auVar215,ZEXT416((uint)(fVar126 * fVar196)));
                      uVar124 = vcmpss_avx512f(ZEXT416((uint)(fVar126 * fVar196)),auVar206,1);
                      auVar37 = vmovshdup_avx(auVar83._0_16_);
                      iVar30 = (int)(float)((uint)!(bool)((byte)uVar124 & 1) * auVar39._0_4_);
                      local_5e8._0_4_ = tMin;
                      for (; lVar32 != 3; lVar32 = lVar32 + 1) {
                        pfVar23 = (float *)(local_598 + 0xc);
                        iVar31 = (int)lVar32;
                        if ((iVar31 != 0) && (pfVar23 = (float *)local_588, iVar31 != 1)) {
                          pfVar23 = (float *)((long)local_588 + 4);
                        }
                        if ((*pfVar23 == 0.0) && (!NAN(*pfVar23))) {
                          puVar24 = (undefined8 *)(local_598 + 0xc);
                          if ((iVar31 != 0) && (puVar24 = (undefined8 *)local_588, iVar31 != 1)) {
                            puVar24 = (undefined8 *)((long)local_588 + 4);
                          }
                          *(undefined4 *)puVar24 = 0;
                        }
                        if (iVar31 == 1) {
                          voxel[1] = iVar28;
                          piVar33 = voxelLimit + 1;
                          piVar34 = step + 1;
                          pfVar26 = deltaT + 1;
                          pfVar23 = nextCrossingT + 1;
                          pfVar25 = (float *)local_588;
                          iVar27 = iVar28;
                        }
                        else if (iVar31 == 0) {
                          voxel[lVar32] = iVar29;
                          piVar33 = voxelLimit;
                          piVar34 = step;
                          pfVar26 = deltaT;
                          pfVar23 = nextCrossingT;
                          pfVar25 = (float *)(local_598 + 0xc);
                          iVar27 = iVar29;
                        }
                        else {
                          piVar33 = voxelLimit + 2;
                          piVar34 = step + 2;
                          pfVar26 = deltaT + 2;
                          pfVar23 = nextCrossingT + 2;
                          pfVar25 = (float *)((long)local_588 + 4);
                          voxel[lVar32] = iVar30;
                          iVar27 = iVar30;
                        }
                        if (0.0 <= *pfVar25) {
                          pfVar25 = (float *)(local_598 + 0xc);
                          pvVar36 = &this_01[10].values;
                          fVar216 = fVar41;
                          fVar218 = fVar43;
                          fVar219 = fVar207;
                          if (iVar31 != 0) {
                            pfVar25 = (float *)local_588;
                            pvVar36 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                      ((long)&this_01[10].values.alloc.memoryResource + 4);
                            fVar216 = fVar209;
                            fVar218 = auVar37._0_4_;
                            fVar219 = 1.0 / fVar209;
                            if (iVar31 != 1) {
                              pfVar25 = (float *)((long)local_588 + 4);
                              pvVar36 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                                        &this_01[10].values.ptr;
                              fVar216 = fVar196;
                              fVar218 = fVar126;
                              fVar219 = 1.0 / fVar196;
                            }
                          }
                          *piVar34 = 1;
                          auVar39 = vcvtsi2ss_avx512f(in_XMM16,iVar27 + 1);
                          fVar4 = *pfVar25;
                          *pfVar26 = fVar219 / fVar4;
                          *pfVar23 = (auVar39._0_4_ / fVar216 - fVar218) / fVar4 + tMin;
                          iVar31 = *(int *)&(pvVar36->alloc).memoryResource;
                        }
                        else {
                          pfVar25 = (float *)(local_598 + 0xc);
                          fVar216 = fVar41;
                          fVar218 = fVar43;
                          fVar219 = -fVar207;
                          if (iVar31 != 0) {
                            pfVar25 = (float *)local_588;
                            fVar216 = fVar209;
                            fVar218 = auVar37._0_4_;
                            fVar219 = -(1.0 / fVar209);
                            if (iVar31 != 1) {
                              pfVar25 = (float *)((long)local_588 + 4);
                              fVar216 = fVar196;
                              fVar218 = fVar126;
                              fVar219 = -(1.0 / fVar196);
                            }
                          }
                          auVar39 = vcvtsi2ss_avx512f(in_XMM16,iVar27);
                          *piVar34 = -1;
                          fVar4 = *pfVar25;
                          *pfVar26 = fVar219 / fVar4;
                          *pfVar23 = (auVar39._0_4_ / fVar216 - fVar218) / fVar4 + tMin;
                          iVar31 = -1;
                        }
                        auVar217 = ZEXT464(0);
                        *piVar33 = iVar31;
                      }
                      fVar41 = RNG::Uniform<float>(&rng);
                      local_568._0_4_ = fVar41;
                      while( true ) {
                        auVar194 = (undefined1  [56])0x0;
                        iVar30 = *(int *)(&DAT_00596420 +
                                         (ulong)((uint)(nextCrossingT[1] < nextCrossingT[2]) |
                                                (uint)(nextCrossingT[0] < nextCrossingT[1]) * 4 +
                                                (uint)(nextCrossingT[0] < nextCrossingT[2]) * 2) * 4
                                         );
                        fVar41 = nextCrossingT[iVar30];
                        auVar125 = (undefined1  [56])0x0;
                        SVar223 = SampledSpectrum::operator*
                                            (&sigma_t,*(Float *)(this_01[9].values.nAlloc +
                                                                (((long)voxel[2] *
                                                                  (long)*(int *)((long)&this_01[10].
                                                                                        values.alloc
                                                                                        .
                                                  memoryResource + 4) + (long)voxel[1]) *
                                                  (long)*(int *)&this_01[10].values.alloc.
                                                                 memoryResource + (long)voxel[0]) *
                                                  4));
                        auVar174._0_8_ = SVar223.values.values._8_8_;
                        auVar174._8_56_ = auVar194;
                        auVar104._0_8_ = SVar223.values.values._0_8_;
                        auVar104._8_56_ = auVar125;
                        auVar195 = ZEXT1664(auVar104._0_16_);
                        sigma_maj.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar104._0_16_,auVar174._0_16_);
                        if (SVar223.values.values[0] <= 0.0) {
                          auVar195 = ZEXT464((uint)local_568._0_4_);
                        }
                        else {
                          fVar43 = (float)local_5e8._0_4_;
                          while( true ) {
                            local_5e8._0_4_ = fVar43;
                            FVar42 = InvertExponentialSample(fVar41 - fVar43,auVar195._0_4_);
                            if (FVar42 <= (float)local_568._0_4_) break;
                            auVar125 = SUB6056((undefined1  [60])0x0,4);
                            FVar42 = SampleExponential((Float)local_568._0_4_,
                                                       sigma_maj.values.values[0]);
                            auVar37 = auVar217._0_16_;
                            auVar39 = auVar208._0_16_;
                            fVar126 = FVar42 + fVar43;
                            auVar194 = (undefined1  [56])0x0;
                            if (tMax <= fVar126) {
                              SampledSpectrum::SampledSpectrum((SampledSpectrum *)&intr_1,1.0);
                              pIVar16 = local_348;
                              IVar17 = intr_1.super_Interaction.pi.
                                       super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
                              local_360 = 0;
                              *local_348 = intr_1.super_Interaction.pi.
                                           super_Point3<pbrt::Interval<float>_>.
                                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
                              pIVar16[1] = IVar17;
                              SampleLd::anon_class_32_4_b07b4888::operator()
                                        ((anon_class_32_4_b07b4888 *)&sigma_a_1,
                                         (MediumSample *)&local_3f8.__align);
                              goto LAB_004377f4;
                            }
                            local_558._0_4_ = fVar126;
                            PVar221 = Ray::operator()(&ray,fVar126);
                            local_548.z = PVar221.super_Tuple3<pbrt::Point3,_float>.z;
                            auVar217._0_8_ = PVar221.super_Tuple3<pbrt::Point3,_float>._0_8_;
                            auVar217._8_56_ = auVar194;
                            local_548._0_8_ = vmovlps_avx(auVar217._0_16_);
                            SVar223 = SampledSpectrum::operator-(&sigma_maj);
                            auVar175._0_8_ = SVar223.values.values._8_8_;
                            auVar175._8_56_ = auVar125;
                            auVar105._0_8_ = SVar223.values.values._0_8_;
                            auVar105._8_56_ = auVar194;
                            intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
                                 vmovlhps_avx(auVar105._0_16_,auVar175._0_16_);
                            auVar194 = (undefined1  [56])0x0;
                            SVar223 = SampledSpectrum::operator*
                                                ((SampledSpectrum *)&intr_1,
                                                 (float)local_558._0_4_ - fVar43);
                            auVar176._0_8_ = SVar223.values.values._8_8_;
                            auVar176._8_56_ = auVar125;
                            auVar106._0_8_ = SVar223.values.values._0_8_;
                            auVar106._8_56_ = auVar194;
                            auVar38 = vmovlhps_avx(auVar106._0_16_,auVar176._0_16_);
                            auVar194 = ZEXT856(auVar38._8_8_);
                            local_3f8.__align = auVar38._0_8_;
                            local_3f8._8_4_ = auVar38._8_4_;
                            local_3f8._12_4_ = auVar38._12_4_;
                            SVar223 = FastExp((SampledSpectrum *)&local_3f8.__align);
                            auVar177._0_8_ = SVar223.values.values._8_8_;
                            auVar177._8_56_ = auVar125;
                            auVar107._0_8_ = SVar223.values.values._0_8_;
                            auVar107._8_56_ = auVar194;
                            local_5e8 = auVar107._0_16_;
                            local_568 = auVar177._0_16_;
                            SVar223 = NanoVDBMediumProvider::Density
                                                (*(NanoVDBMediumProvider **)this_01,
                                                 (Point3f *)&local_548,local_5c0);
                            auVar178._0_8_ = SVar223.values.values._8_8_;
                            auVar178._8_56_ = auVar125;
                            auVar108._0_8_ = SVar223.values.values._0_8_;
                            auVar108._8_56_ = auVar194;
                            density.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar108._0_16_,auVar178._0_16_);
                            auVar194 = ZEXT856(density.values.values._8_8_);
                            SVar223 = NanoVDBMediumProvider::Le
                                                (*(NanoVDBMediumProvider **)this_01,
                                                 (Point3f *)&local_548,local_5c0);
                            auVar179._0_8_ = SVar223.values.values._8_8_;
                            auVar179._8_56_ = auVar125;
                            auVar109._0_8_ = SVar223.values.values._0_8_;
                            auVar109._8_56_ = auVar194;
                            Le.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar109._0_16_,auVar179._0_16_);
                            auVar125 = ZEXT856(Le.values.values._8_8_);
                            PVar222 = Transform::operator()
                                                ((Transform *)&this_01[6].values,
                                                 (Point3<float> *)&local_548);
                            uVar124 = auVar125._0_8_;
                            auVar193 = auVar179._4_12_;
                            local_460.z = PVar222.super_Tuple3<pbrt::Point3,_float>.z;
                            auVar110._0_8_ = PVar222.super_Tuple3<pbrt::Point3,_float>._0_8_;
                            auVar110._8_56_ = auVar125;
                            local_460._0_8_ = vmovlps_avx(auVar110._0_16_);
                            VVar220 = Normalize<float>(&lightRay.d);
                            auVar48._0_8_ =
                                 VVar220.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                                 0x8000000080000000;
                            auVar48._8_4_ = (uint)uVar124 ^ 0x80000000;
                            auVar48._12_4_ = (uint)((ulong)uVar124 >> 0x20) ^ 0x80000000;
                            local_470.z = -VVar220.super_Tuple3<pbrt::Vector3,_float>.z;
                            auVar129._0_8_ =
                                 CONCAT44(auVar193._0_4_,
                                          VVar220.super_Tuple3<pbrt::Vector3,_float>.z) ^
                                 0x8000000080000000;
                            auVar129._8_4_ = auVar193._4_4_ ^ 0x80000000;
                            auVar129._12_4_ = auVar193._8_4_ ^ 0x80000000;
                            auVar194 = ZEXT856(auVar129._8_8_);
                            local_470._0_8_ = vmovlps_avx(auVar48);
                            auVar125 = (undefined1  [56])0x0;
                            local_5b4 = lightRay.time;
                            SVar223 = SampledSpectrum::operator*(&sigma_a,&density);
                            auVar180._0_8_ = SVar223.values.values._8_8_;
                            auVar180._8_56_ = auVar194;
                            auVar111._0_8_ = SVar223.values.values._0_8_;
                            auVar111._8_56_ = auVar125;
                            auVar38 = vmovlhps_avx(auVar111._0_16_,auVar180._0_16_);
                            auVar125 = ZEXT856(auVar38._8_8_);
                            local_3f8.__align = auVar38._0_8_;
                            local_3f8._8_4_ = auVar38._8_4_;
                            local_3f8._12_4_ = auVar38._12_4_;
                            SVar223 = SampledSpectrum::operator*(&sigma_s,&density);
                            auVar181._0_8_ = SVar223.values.values._8_8_;
                            auVar181._8_56_ = auVar194;
                            auVar112._0_8_ = SVar223.values.values._0_8_;
                            auVar112._8_56_ = auVar125;
                            local_288.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar112._0_16_,auVar181._0_16_);
                            local_480.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
                                 (TaggedPointer<pbrt::HGPhaseFunction>)
                                 (TaggedPointer<pbrt::HGPhaseFunction>)
                                 ((ulong)((long)&this_01[2].values.nStored + 4U) | 0x1000000000000);
                            local_478.bits = (ulong)this_01 | 0x4000000000000;
                            MediumInteraction::MediumInteraction
                                      (&intr_1,(Point3f *)&local_460,(Vector3f *)&local_470,
                                       local_5b4,(SampledSpectrum *)&local_3f8.__align,&local_288,
                                       &sigma_maj,&Le,(MediumHandle *)&local_478,&local_480);
                            local_360 = 1;
                            local_3f8._64_8_ = intr_1.super_Interaction.mediumInterface;
                            local_3f8.__align =
                                 (anon_struct_8_0_00000001_for___align)
                                 intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
                            local_3f8._8_4_ =
                                 intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
                            local_3f8._12_4_ =
                                 intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
                            local_3f8._16_4_ =
                                 intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
                            local_3f8._20_4_ =
                                 intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
                            local_3f8._24_4_ = intr_1.super_Interaction.time;
                            local_3f8._28_4_ =
                                 intr_1.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
                            local_3f8._32_4_ =
                                 intr_1.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
                            local_3f8._36_4_ =
                                 intr_1.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
                            local_3f8._40_4_ =
                                 intr_1.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
                            local_3f8._44_4_ =
                                 intr_1.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
                            local_3f8._48_4_ =
                                 intr_1.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
                            local_3f8._52_4_ =
                                 intr_1.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
                            local_3f8._56_8_ = intr_1.super_Interaction._56_8_;
                            local_3f8._72_8_ =
                                 intr_1.super_Interaction.medium.
                                 super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                                 .bits;
                            local_3f8._80_8_ =
                                 intr_1.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits;
                            local_3f8._88_16_ = (undefined1  [16])intr_1.sigma_a.values.values;
                            local_3f8._104_16_ = (undefined1  [16])intr_1.sigma_s.values.values;
                            local_3f8._120_16_ = (undefined1  [16])intr_1.sigma_maj.values.values;
                            local_3f8._136_16_ = (undefined1  [16])intr_1.Le.values.values;
                            local_358 = vunpcklpd_avx(local_5e8,local_568);
                            auVar125 = ZEXT856((ulong)intr_1.phase.
                                                      super_TaggedPointer<pbrt::HGPhaseFunction>.
                                                      bits);
                            auVar208 = ZEXT1664(auVar39);
                            auVar217 = ZEXT1664(auVar37);
                            bVar18 = SampleLd::anon_class_32_4_b07b4888::operator()
                                               ((anon_class_32_4_b07b4888 *)&sigma_a_1,
                                                (MediumSample *)&local_3f8.__align);
                            pstd::optional<pbrt::MediumInteraction>::~optional
                                      ((optional<pbrt::MediumInteraction> *)&local_3f8.__align);
                            if (!bVar18) goto LAB_004376c2;
                            fVar43 = RNG::Uniform<float>(&rng);
                            local_568._0_4_ = fVar43;
                            auVar195 = ZEXT464((uint)sigma_maj.values.values[0]);
                            fVar43 = (float)local_558._0_4_;
                          }
                          auVar39 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                               ZEXT416((uint)(((float)local_568._0_4_ - FVar42) /
                                                             (1.0 - FVar42))));
                          auVar195 = ZEXT1664(auVar39);
                        }
                        auVar125 = auVar195._8_56_;
                        if ((tMax < fVar41) ||
                           (iVar28 = voxel[iVar30], voxel[iVar30] = iVar28 + step[iVar30],
                           iVar28 + step[iVar30] == voxelLimit[iVar30])) break;
                        local_568._0_4_ = auVar195._0_4_;
                        local_5e8._0_4_ = fVar41;
                        nextCrossingT[iVar30] = fVar41 + deltaT[iVar30];
                      }
                    }
                  }
                }
                goto LAB_004377fc;
              }
              pSVar22 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
              if (((pSVar22->intr).material.
                   super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                   .bits & 0xffffffffffff) == 0) goto LAB_00435572;
              goto LAB_004378a9;
            }
            SampledSpectrum::SampledSpectrum(&local_340,0.0);
            goto LAB_004353b5;
          }
        }
        SampledSpectrum::SampledSpectrum(&local_340,0.0);
        goto LAB_004353b5;
      }
    }
    LogFatal<char_const(&)[43]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
               ,0x50a,"Check failed: %s",(char (*) [43])"light != nullptr && sampledLight->pdf != 0"
              );
  }
  SampledSpectrum::SampledSpectrum(&local_340,0.0);
LAB_004353b5:
  pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
  return (array<float,_4>)(array<float,_4>)local_340;
LAB_004376c2:
LAB_004377fc:
  bVar18 = SampledSpectrum::operator_cast_to_bool(&throughput);
  if (!bVar18) {
LAB_004378a9:
    SampledSpectrum::SampledSpectrum(&local_340,0.0);
    pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
    goto LAB_004353b5;
  }
  if (si.set != true) goto LAB_004378cc;
  pSVar22 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
  Interaction::SpawnRayTo((Ray *)&local_3f8.__align,(Interaction *)pSVar22,&ls.pLight);
  auVar195 = ZEXT1664(CONCAT412(local_3f8._24_4_,
                                CONCAT48(local_3f8._20_4_,
                                         CONCAT44(local_3f8._16_4_,local_3f8._12_4_))));
  lightRay.time = (Float)local_3f8._24_4_;
  lightRay.o.super_Tuple3<pbrt::Point3,_float>.x = local_3f8.__align._0_4_;
  lightRay.o.super_Tuple3<pbrt::Point3,_float>.y = local_3f8.__align._4_4_;
  lightRay.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             )local_3f8._32_8_;
  lightRay._8_8_ = local_3f8._8_8_;
  lightRay.d.super_Tuple3<pbrt::Vector3,_float>._4_8_ = local_3f8._16_8_;
  pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
  goto LAB_00435524;
LAB_004378cc:
  pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
  auVar194 = (undefined1  [56])0x0;
  SVar223 = SampledSpectrum::operator*(pathPDF,fVar3 * ls.pdf);
  auVar184._0_8_ = SVar223.values.values._8_8_;
  auVar184._8_56_ = auVar125;
  auVar115._0_8_ = SVar223.values.values._0_8_;
  auVar115._8_56_ = auVar194;
  si.optionalValue._0_16_ = vmovlhps_avx(auVar115._0_16_,auVar184._0_16_);
  auVar194 = ZEXT856(si.optionalValue._8_8_);
  SampledSpectrum::operator*=(&pdfLight,(SampledSpectrum *)&si);
  if (*(uint *)(uVar7 & 0xffffffffffff) < 2) {
    SVar223 = SampledSpectrum::operator*(&betaLight,&ls.L);
    auVar185._0_8_ = SVar223.values.values._8_8_;
    auVar185._8_56_ = auVar125;
    auVar116._0_8_ = SVar223.values.values._0_8_;
    auVar116._8_56_ = auVar194;
    auVar39 = vmovlhps_avx(auVar116._0_16_,auVar185._0_16_);
    auVar194 = ZEXT856(auVar39._8_8_);
    local_3f8.__align = auVar39._0_8_;
    local_3f8._8_4_ = auVar39._8_4_;
    local_3f8._12_4_ = auVar39._12_4_;
    SVar223 = SampledSpectrum::operator*((SampledSpectrum *)&local_3f8.__align,&throughput);
    auVar186._0_8_ = SVar223.values.values._8_8_;
    auVar186._8_56_ = auVar125;
    auVar117._0_8_ = SVar223.values.values._0_8_;
    auVar117._8_56_ = auVar194;
    si.optionalValue._0_16_ = vmovlhps_avx(auVar117._0_16_,auVar186._0_16_);
    FVar40 = SampledSpectrum::Average(&pdfLight);
    auVar194 = extraout_var_01;
    SVar223 = SampledSpectrum::operator/((SampledSpectrum *)&si,FVar40);
    auVar187._0_8_ = SVar223.values.values._8_8_;
    auVar187._8_56_ = auVar125;
    auVar37 = auVar187._0_16_;
    auVar118._0_8_ = SVar223.values.values._0_8_;
    auVar118._8_56_ = auVar194;
    auVar39 = auVar118._0_16_;
  }
  else {
    auVar194 = (undefined1  [56])0x0;
    SVar223 = SampledSpectrum::operator*(pathPDF,FVar40);
    auVar188._0_8_ = SVar223.values.values._8_8_;
    auVar188._8_56_ = auVar125;
    auVar119._0_8_ = SVar223.values.values._0_8_;
    auVar119._8_56_ = auVar194;
    si.optionalValue._0_16_ = vmovlhps_avx(auVar119._0_16_,auVar188._0_16_);
    auVar194 = ZEXT856(si.optionalValue._8_8_);
    SampledSpectrum::operator*=(&pdfUni,(SampledSpectrum *)&si);
    SVar223 = SampledSpectrum::operator*(&betaLight,&ls.L);
    auVar189._0_8_ = SVar223.values.values._8_8_;
    auVar189._8_56_ = auVar125;
    auVar120._0_8_ = SVar223.values.values._0_8_;
    auVar120._8_56_ = auVar194;
    auVar39 = vmovlhps_avx(auVar120._0_16_,auVar189._0_16_);
    auVar194 = ZEXT856(auVar39._8_8_);
    local_3f8.__align = auVar39._0_8_;
    local_3f8._8_4_ = auVar39._8_4_;
    local_3f8._12_4_ = auVar39._12_4_;
    SVar223 = SampledSpectrum::operator*((SampledSpectrum *)&local_3f8.__align,&throughput);
    auVar190._0_8_ = SVar223.values.values._8_8_;
    auVar190._8_56_ = auVar125;
    auVar121._0_8_ = SVar223.values.values._0_8_;
    auVar121._8_56_ = auVar194;
    si.optionalValue._0_16_ = vmovlhps_avx(auVar121._0_16_,auVar190._0_16_);
    auVar194 = ZEXT856(si.optionalValue._8_8_);
    SVar223 = SampledSpectrum::operator+(&pdfLight,&pdfUni);
    auVar191._0_8_ = SVar223.values.values._8_8_;
    auVar191._8_56_ = auVar125;
    auVar122._0_8_ = SVar223.values.values._0_8_;
    auVar122._8_56_ = auVar194;
    intr_1.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ =
         vmovlhps_avx(auVar122._0_16_,auVar191._0_16_);
    FVar40 = SampledSpectrum::Average((SampledSpectrum *)&intr_1);
    auVar194 = extraout_var_02;
    SVar223 = SampledSpectrum::operator/((SampledSpectrum *)&si,FVar40);
    auVar192._0_8_ = SVar223.values.values._8_8_;
    auVar192._8_56_ = auVar125;
    auVar37 = auVar192._0_16_;
    auVar123._0_8_ = SVar223.values.values._0_8_;
    auVar123._8_56_ = auVar194;
    auVar39 = auVar123._0_16_;
  }
  local_340.values.values = (array<float,_4>)vmovlhps_avx(auVar39,auVar37);
  goto LAB_004353b5;
}

Assistant:

SampledSpectrum VolPathIntegrator::SampleLd(const Interaction &intr, const BSDF *bsdf,
                                            SampledWavelengths &lambda,
                                            SamplerHandle sampler,
                                            const SampledSpectrum &beta,
                                            const SampledSpectrum &pathPDF) const {
    // Sample a light source using _lightSampler_
    Float u = sampler.Get1D();
    pstd::optional<SampledLight> sampledLight =
        bsdf ? lightSampler.Sample(intr.AsSurface(), u) : lightSampler.Sample(intr, u);
    Point2f uLight = sampler.Get2D();
    if (!sampledLight)
        return SampledSpectrum(0.f);
    LightHandle light = sampledLight->light;
    CHECK(light != nullptr && sampledLight->pdf != 0);

    // Sample a point on the light source
    LightSampleContext ctx;
    if (bsdf)
        ctx = LightSampleContext(intr.AsSurface());
    else
        ctx = LightSampleContext(intr);
    LightLiSample ls = light.SampleLi(ctx, uLight, lambda, LightSamplingMode::WithMIS);
    if (!ls || !ls.L)
        return SampledSpectrum(0.f);
    Float lightPDF = sampledLight->pdf * ls.pdf;

    // Evaluate BSDF or phase function for light sample direction
    Float scatterPDF;
    SampledSpectrum betaLight = beta;
    Vector3f wo = intr.wo, wi = ls.wi;
    if (bsdf) {
        // Update _bsdfLight_ and _scatterPDF_ accounting for the BSDF
        betaLight *= bsdf->f(wo, wi) * AbsDot(wi, intr.AsSurface().shading.n);
        scatterPDF = bsdf->PDF(wo, wi);

    } else {
        // Update _bsdfLight_ and _scatterPDF_ accounting for the phase function
        CHECK(intr.IsMediumInteraction());
        PhaseFunctionHandle phase = intr.AsMedium().phase;
        betaLight *= phase.p(wo, wi);
        scatterPDF = phase.PDF(wo, wi);
    }
    if (!betaLight)
        return SampledSpectrum(0.f);

    // Declare path state variables for ray to light source
    Ray lightRay = intr.SpawnRayTo(ls.pLight);
    SampledSpectrum throughput(1.f), pdfLight(1.f), pdfUni(1.f);
    RNG rng(Hash(lightRay.o), Hash(lightRay.d));

    while (true) {
        // Trace ray through media to estimate transmittance
        pstd::optional<ShapeIntersection> si = Intersect(lightRay, 1 - ShadowEpsilon);
        // Handle opaque surface along ray's path
        if (si && si->intr.material)
            return SampledSpectrum(0.f);

        // Update transmittance for current ray segment
        if (lightRay.medium != nullptr) {
            Float tMax = si ? si->tHit : (1 - ShadowEpsilon);
            lightRay.medium.SampleTmaj(
                lightRay, tMax, rng, lambda, [&](const MediumSample &mediumSample) {
                    // Account for medium scattering event along shadow ray
                    const SampledSpectrum &Tmaj = mediumSample.Tmaj;
                    if (!mediumSample.intr) {
                        // CO                        betaLight *= Tmaj;
                        return false;
                    }
                    const MediumInteraction &intr = *mediumSample.intr;
                    // Update _throughput_ and PDFs using ratio-tracking estimator
                    SampledSpectrum sigma_n = intr.sigma_n();
                    // ratio-tracking: only evaluate null scattering
                    throughput *= Tmaj * sigma_n;
                    pdfLight *= Tmaj * intr.sigma_maj;
                    pdfUni *= Tmaj * sigma_n;

                    Float pSurvive =
                        throughput.MaxComponentValue() / (pdfLight + pdfUni).Average();
                    if (pSurvive < .25f) {
                        if (rng.Uniform<Float>() > pSurvive)
                            throughput = SampledSpectrum(0.);
                        else
                            throughput /= pSurvive;
                    }

                    if (!throughput)
                        return false;
                    rescale(throughput, pdfLight, pdfUni);
                    return true;
                });
        }

        // Generate next ray segment or return final transmittance
        if (!throughput)
            return SampledSpectrum(0.f);
        if (!si)
            break;
        lightRay = si->intr.SpawnRayTo(ls.pLight);
    }
    // Return weighted light contribution to direct lighting
    pdfLight *= pathPDF * lightPDF;  // p_nee in paper
    if (IsDeltaLight(light.Type()))
        // pdfUni unused...
        return betaLight * ls.L * throughput / pdfLight.Average();
    else {
        pdfUni *= pathPDF * scatterPDF;
        return betaLight * ls.L * throughput / (pdfLight + pdfUni).Average();
    }
}